

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::convertGeometries
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float *pfVar5;
  float fVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  byte bVar11;
  size_t sVar12;
  long lVar13;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar14;
  size_t sVar15;
  Ref<embree::SceneGraph::Node> *pRVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  long *plVar60;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar61;
  long *plVar62;
  TriangleMeshNode *pTVar63;
  BBox1f BVar64;
  QuadMeshNode *pQVar65;
  GridMeshNode *pGVar66;
  PointSetNode *pPVar67;
  runtime_error *prVar68;
  byte bVar69;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  size_t *extraout_RDX_12;
  size_t *psVar70;
  size_t *extraout_RDX_13;
  size_t *extraout_RDX_14;
  size_t *extraout_RDX_15;
  size_t *extraout_RDX_16;
  size_t *extraout_RDX_17;
  size_t *extraout_RDX_18;
  size_t *extraout_RDX_19;
  size_t *extraout_RDX_20;
  size_t *extraout_RDX_21;
  size_t *extraout_RDX_22;
  size_t *extraout_RDX_23;
  ulong uVar71;
  ulong uVar72;
  LinearSpace3<embree::Vec3fx> *pLVar73;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  long lVar74;
  uint uVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  float fVar79;
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  Transformations c;
  float local_188;
  float local_178;
  float fStack_174;
  Transformations local_168;
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_120;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  BBox1f local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  long *local_88;
  long *local_80;
  SceneGraphFlattener *local_78;
  Ref<embree::SceneGraph::PointSetNode> local_70;
  Ref<embree::SceneGraph::HairSetNode> local_68;
  Ref<embree::SceneGraph::SubdivMeshNode> local_60;
  Ref<embree::SceneGraph::GridMeshNode> local_58;
  Ref<embree::SceneGraph::QuadMeshNode> local_50;
  Ref<embree::SceneGraph::TriangleMeshNode> local_48;
  Ref<embree::SceneGraph::Node> *local_40;
  ulong local_38;
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  
  local_120 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
               *)group;
  local_78 = this;
  if (node->ptr == (Node *)0x0) {
    plVar60 = (long *)0x0;
  }
  else {
    plVar60 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::TransformNode::typeinfo,0);
  }
  local_88 = plVar60;
  if (plVar60 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      local_80 = (long *)0x0;
    }
    else {
      local_80 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::MultiTransformNode::typeinfo,0);
    }
    if (local_80 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar62 = (long *)0x0;
      }
      else {
        plVar62 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
      }
      if (plVar62 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          pTVar63 = (TriangleMeshNode *)0x0;
        }
        else {
          pTVar63 = (TriangleMeshNode *)
                    __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                   &SceneGraph::TriangleMeshNode::typeinfo,0);
        }
        if (pTVar63 == (TriangleMeshNode *)0x0) {
          if (node->ptr == (Node *)0x0) {
            pQVar65 = (QuadMeshNode *)0x0;
          }
          else {
            pQVar65 = (QuadMeshNode *)
                      __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::QuadMeshNode::typeinfo,0);
          }
          if (pQVar65 == (QuadMeshNode *)0x0) {
            if (node->ptr == (Node *)0x0) {
              pGVar66 = (GridMeshNode *)0x0;
            }
            else {
              pGVar66 = (GridMeshNode *)
                        __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::GridMeshNode::typeinfo,0);
            }
            if (pGVar66 == (GridMeshNode *)0x0) {
              if (node->ptr == (Node *)0x0) {
                local_138 = (SubdivMeshNode *)0x0;
              }
              else {
                local_138 = (SubdivMeshNode *)
                            __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::SubdivMeshNode::typeinfo,0);
              }
              if (local_138 == (SubdivMeshNode *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  local_118 = (HairSetNode *)0x0;
                }
                else {
                  local_118 = (HairSetNode *)
                              __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::HairSetNode::typeinfo,0);
                }
                if (local_118 == (HairSetNode *)0x0) {
                  if (node->ptr == (Node *)0x0) {
                    pPVar67 = (PointSetNode *)0x0;
                  }
                  else {
                    pPVar67 = (PointSetNode *)
                              __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::PointSetNode::typeinfo,0);
                  }
                  if (pPVar67 != (PointSetNode *)0x0) {
                    (*(pPVar67->super_Node).super_RefCount._vptr_RefCount[2])(pPVar67);
                    local_f8 = (BBox1f)operator_new(0xb0);
                    local_70.ptr = pPVar67;
                    iVar76 = (*(pPVar67->super_Node).super_RefCount._vptr_RefCount[2])(pPVar67);
                    BVar64 = local_f8;
                    local_108._0_4_ = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar76 >> 8),1);
                    SceneGraph::PointSetNode::PointSetNode
                              ((PointSetNode *)local_f8,&local_70,spaces);
                    local_168.time_range = BVar64;
                    auVar58._12_4_ = 0;
                    auVar58._0_12_ = local_108._4_12_;
                    local_108 = auVar58 << 0x20;
                    (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                    std::
                    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                              (local_120,(Ref<embree::SceneGraph::Node> *)&local_168);
                    if (local_168.time_range != (BBox1f)0x0) {
                      (**(code **)(*(long *)local_168.time_range + 0x18))();
                    }
                    if (local_70.ptr != (PointSetNode *)0x0) {
                      (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                    }
                  }
                  if (pPVar67 != (PointSetNode *)0x0) {
                    (*(pPVar67->super_Node).super_RefCount._vptr_RefCount[3])(pPVar67);
                  }
                }
                else {
                  (*(local_118->super_Node).super_RefCount._vptr_RefCount[2])(local_118);
                  BVar64 = (BBox1f)operator_new(0x118);
                  local_68.ptr = local_118;
                  (*(local_118->super_Node).super_RefCount._vptr_RefCount[2])();
                  SceneGraph::HairSetNode::HairSetNode((HairSetNode *)BVar64,&local_68,spaces);
                  local_168.time_range = BVar64;
                  (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                  std::
                  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                  ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                            (local_120,(Ref<embree::SceneGraph::Node> *)&local_168);
                  if (local_168.time_range != (BBox1f)0x0) {
                    (**(code **)(*(long *)local_168.time_range + 0x18))();
                  }
                  if (local_68.ptr != (HairSetNode *)0x0) {
                    (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                  }
                }
                if (local_118 != (HairSetNode *)0x0) {
                  (*(local_118->super_Node).super_RefCount._vptr_RefCount[3])();
                }
              }
              else {
                (*(local_138->super_Node).super_RefCount._vptr_RefCount[2])(local_138);
                BVar64 = (BBox1f)operator_new(0x1b0);
                local_60.ptr = local_138;
                (*(local_138->super_Node).super_RefCount._vptr_RefCount[2])();
                SceneGraph::SubdivMeshNode::SubdivMeshNode
                          ((SubdivMeshNode *)BVar64,&local_60,spaces);
                local_168.time_range = BVar64;
                (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                std::
                vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                          (local_120,(Ref<embree::SceneGraph::Node> *)&local_168);
                if (local_168.time_range != (BBox1f)0x0) {
                  (**(code **)(*(long *)local_168.time_range + 0x18))();
                }
                if (local_60.ptr != (SubdivMeshNode *)0x0) {
                  (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                }
              }
              if (local_138 != (SubdivMeshNode *)0x0) {
                (*(local_138->super_Node).super_RefCount._vptr_RefCount[3])();
              }
            }
            else {
              (*(pGVar66->super_Node).super_RefCount._vptr_RefCount[2])(pGVar66);
              BVar64 = (BBox1f)operator_new(0xa8);
              local_58.ptr = pGVar66;
              (*(pGVar66->super_Node).super_RefCount._vptr_RefCount[2])();
              SceneGraph::GridMeshNode::GridMeshNode((GridMeshNode *)BVar64,&local_58,spaces);
              local_168.time_range = BVar64;
              (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        (local_120,(Ref<embree::SceneGraph::Node> *)&local_168);
              if (local_168.time_range != (BBox1f)0x0) {
                (**(code **)(*(long *)local_168.time_range + 0x18))();
              }
              if (local_58.ptr != (GridMeshNode *)0x0) {
                (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
              }
            }
            if (pGVar66 != (GridMeshNode *)0x0) {
              (*(pGVar66->super_Node).super_RefCount._vptr_RefCount[3])();
            }
          }
          else {
            (*(pQVar65->super_Node).super_RefCount._vptr_RefCount[2])(pQVar65);
            BVar64 = (BBox1f)operator_new(0xd8);
            local_50.ptr = pQVar65;
            (*(pQVar65->super_Node).super_RefCount._vptr_RefCount[2])();
            SceneGraph::QuadMeshNode::QuadMeshNode((QuadMeshNode *)BVar64,&local_50,spaces);
            local_168.time_range = BVar64;
            (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
            std::
            vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
            ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                      (local_120,(Ref<embree::SceneGraph::Node> *)&local_168);
            if (local_168.time_range != (BBox1f)0x0) {
              (**(code **)(*(long *)local_168.time_range + 0x18))();
            }
            if (local_50.ptr != (QuadMeshNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
          }
          if (pQVar65 != (QuadMeshNode *)0x0) {
            (*(pQVar65->super_Node).super_RefCount._vptr_RefCount[3])();
          }
        }
        else {
          (*(pTVar63->super_Node).super_RefCount._vptr_RefCount[2])(pTVar63);
          BVar64 = (BBox1f)operator_new(0xd8);
          local_48.ptr = pTVar63;
          (*(pTVar63->super_Node).super_RefCount._vptr_RefCount[2])(pTVar63);
          SceneGraph::TriangleMeshNode::TriangleMeshNode
                    ((TriangleMeshNode *)BVar64,&local_48,spaces);
          local_168.time_range = BVar64;
          (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
          ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                    (local_120,(Ref<embree::SceneGraph::Node> *)&local_168);
          if (local_168.time_range != (BBox1f)0x0) {
            (**(code **)(*(long *)local_168.time_range + 0x18))();
          }
          if (local_48.ptr != (TriangleMeshNode *)0x0) {
            (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
          }
        }
        if (pTVar63 != (TriangleMeshNode *)0x0) {
          (*(pTVar63->super_Node).super_RefCount._vptr_RefCount[3])(pTVar63);
        }
      }
      else {
        (**(code **)(*plVar62 + 0x10))(plVar62);
        pRVar16 = (Ref<embree::SceneGraph::Node> *)plVar62[0xe];
        for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar62[0xd]; node_00 != pRVar16;
            node_00 = node_00 + 1) {
          convertGeometries(local_78,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                      *)local_120,node_00,spaces);
        }
      }
      if (plVar62 != (long *)0x0) {
        (**(code **)(*plVar62 + 0x18))(plVar62);
      }
    }
    else {
      (**(code **)(*local_80 + 0x10))(local_80);
      pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)local_80[0xd];
      if ((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)local_80[0xe] != pAVar61) {
        local_40 = (Ref<embree::SceneGraph::Node> *)(local_80 + 0x10);
        uVar71 = 0;
        do {
          psVar70 = &local_168.spaces.size_active;
          pLVar73 = &pAVar61->l + uVar71;
          sVar12 = (spaces->spaces).size_active;
          local_38 = uVar71;
          if (sVar12 == 1) {
            fVar79 = (spaces->time_range).lower;
            fVar104 = (spaces->time_range).upper;
            uVar7 = *(undefined8 *)&(pLVar73->vx).field_0;
            fVar113 = (float)uVar7;
            fVar128 = (float)((ulong)uVar7 >> 0x20);
            uVar75 = -(uint)(fVar79 < fVar113);
            uVar77 = -(uint)(fVar104 < fVar128);
            sVar12 = *(size_t *)&(pLVar73->vy).field_0;
            local_168.time_range.upper = (float)(~uVar77 & (uint)fVar128 | (uint)fVar104 & uVar77);
            local_168.time_range.lower = (float)(~uVar75 & (uint)fVar79 | (uint)fVar113 & uVar75);
            local_168.spaces.size_active = 0;
            local_168.spaces.size_alloced = 0;
            local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar12 != 0) {
              pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        alignedMalloc(sVar12 << 6,0x10);
              psVar70 = extraout_RDX_12;
              local_168.spaces.size_alloced = sVar12;
              local_168.spaces.items = pAVar61;
            }
            local_168.quaternion = false;
            local_168.spaces.size_active = local_168.spaces.size_alloced;
            if (*(long *)&(pLVar73->vy).field_0 != 0) {
              lVar74 = 0x30;
              uVar71 = 0;
              do {
                uVar75 = (uint)psVar70;
                pAVar14 = (spaces->spaces).items;
                lVar13 = *(long *)&(pLVar73->vz).field_0;
                bVar10 = spaces->quaternion;
                bVar11 = *(byte *)((long)&(pLVar73->vz).field_0 + 8);
                local_168.quaternion = false;
                fVar79 = (pAVar14->l).vx.field_0.m128[0];
                uVar7 = *(undefined8 *)((long)&(pAVar14->l).vx.field_0 + 4);
                fVar104 = (float)((ulong)uVar7 >> 0x20);
                local_188 = (float)uVar7;
                if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_188 != 0.0)) ||
                   (((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))))) {
LAB_001634f8:
                  uVar7 = *(undefined8 *)(lVar13 + -0x30 + lVar74);
                  fVar113 = (float)uVar7;
                  fVar128 = (float)((ulong)uVar7 >> 0x20);
                  iVar76 = -(uint)(fVar113 != 1.0);
                  iVar78 = -(uint)(fVar128 != 0.0);
                  auVar87._4_4_ = iVar78;
                  auVar87._0_4_ = iVar76;
                  auVar87._8_4_ = iVar78;
                  auVar87._12_4_ = iVar78;
                  auVar86._8_8_ = auVar87._8_8_;
                  auVar86._4_4_ = iVar76;
                  auVar86._0_4_ = iVar76;
                  uVar75 = movmskpd(uVar75,auVar86);
                  psVar70 = (size_t *)(ulong)uVar75;
                  fVar79 = *(float *)(lVar13 + -0x28 + lVar74);
                  if ((uVar75 & 1) == 0) {
                    bVar69 = (byte)uVar75 >> 1;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    psVar70 = (size_t *)(ulong)uVar75;
                    if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                      pfVar1 = (float *)(lVar13 + -0x24 + lVar74);
                      auVar49._4_4_ = -(uint)(pfVar1[1] != 0.0);
                      auVar49._0_4_ = -(uint)(*pfVar1 != 0.0);
                      auVar49._8_4_ = -(uint)(pfVar1[2] != 1.0);
                      auVar49._12_4_ = -(uint)(pfVar1[3] != 0.0);
                      uVar75 = movmskps(uVar75,auVar49);
                      psVar70 = (size_t *)(ulong)uVar75;
                      if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                         ((uVar75 & 4) == 0)) {
                        bVar69 = ((byte)uVar75 & 8) >> 3;
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                        psVar70 = (size_t *)(ulong)uVar75;
                        if (bVar69 == 0) {
                          pfVar1 = (float *)(lVar13 + -0x14 + lVar74);
                          auVar50._4_4_ = -(uint)(pfVar1[1] != 0.0);
                          auVar50._0_4_ = -(uint)(*pfVar1 != 0.0);
                          auVar50._8_4_ = -(uint)(pfVar1[2] != 0.0);
                          auVar50._12_4_ = -(uint)(pfVar1[3] != 1.0);
                          uVar75 = movmskps(uVar75,auVar50);
                          psVar70 = (size_t *)(ulong)uVar75;
                          if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) {
                            bVar69 = ((byte)uVar75 & 8) >> 3;
                            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                            psVar70 = (size_t *)(ulong)uVar75;
                            if (bVar69 == 0) {
                              pfVar1 = (float *)(lVar13 + -4 + lVar74);
                              auVar51._4_4_ = -(uint)(pfVar1[1] != 0.0);
                              auVar51._0_4_ = -(uint)(*pfVar1 != 0.0);
                              auVar51._8_4_ = -(uint)(pfVar1[2] != 0.0);
                              auVar51._12_4_ = -(uint)(pfVar1[3] != 0.0);
                              uVar75 = movmskps(uVar75,auVar51);
                              psVar70 = (size_t *)(ulong)uVar75;
                              if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                   ((uVar75 & 4) == 0)) &&
                                  (bVar69 = ((byte)uVar75 & 8) >> 3,
                                  psVar70 = (size_t *)(ulong)CONCAT31((int3)(uVar75 >> 8),bVar69),
                                  bVar69 == 0)) &&
                                 ((bVar11 == 0 ||
                                  ((fVar123 = *(float *)(lVar13 + 0xc + lVar74), fVar123 == 1.0 &&
                                   (!NAN(fVar123))))))) {
                                fVar101 = (pAVar14->l).vx.field_0.m128[0];
                                local_188 = (pAVar14->l).vx.field_0.m128[1];
                                fVar104 = (pAVar14->l).vx.field_0.m128[2];
                                fVar79 = (pAVar14->l).vx.field_0.m128[3];
                                fVar113 = (pAVar14->l).vy.field_0.m128[0];
                                fVar99 = (pAVar14->l).vy.field_0.m128[1];
                                fVar121 = (pAVar14->l).vy.field_0.m128[2];
                                fVar123 = (pAVar14->l).vy.field_0.m128[3];
                                fVar105 = (pAVar14->l).vz.field_0.m128[0];
                                fVar107 = (pAVar14->l).vz.field_0.m128[1];
                                fVar109 = (pAVar14->l).vz.field_0.m128[2];
                                fVar100 = (pAVar14->l).vz.field_0.m128[3];
                                fVar128 = (pAVar14->p).field_0.m128[0];
                                fVar108 = (pAVar14->p).field_0.m128[1];
                                fVar92 = (pAVar14->p).field_0.m128[2];
                                fVar111 = (pAVar14->p).field_0.m128[3];
                                local_168.quaternion = bVar10;
                                goto LAB_00163fce;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((bVar10 == false) && (bVar11 == 0)) {
                    fVar138 = (pAVar14->l).vx.field_0.m128[0];
                    fVar93 = (pAVar14->l).vx.field_0.m128[1];
                    fVar94 = (pAVar14->l).vx.field_0.m128[2];
                    fVar95 = (pAVar14->l).vx.field_0.m128[3];
                    fVar96 = (pAVar14->l).vy.field_0.m128[0];
                    fVar97 = (pAVar14->l).vy.field_0.m128[1];
                    fVar98 = (pAVar14->l).vy.field_0.m128[2];
                    fVar102 = (pAVar14->l).vy.field_0.m128[3];
                    fVar103 = (pAVar14->l).vz.field_0.m128[0];
                    fVar136 = (pAVar14->l).vz.field_0.m128[1];
                    fVar106 = (pAVar14->l).vz.field_0.m128[2];
                    fVar137 = (pAVar14->l).vz.field_0.m128[3];
                    fVar101 = fVar113 * fVar138 + fVar128 * fVar96 + fVar79 * fVar103;
                    local_188 = fVar113 * fVar93 + fVar128 * fVar97 + fVar79 * fVar136;
                    fVar104 = fVar113 * fVar94 + fVar128 * fVar98 + fVar79 * fVar106;
                    fVar99 = *(float *)(lVar13 + -0x20 + lVar74);
                    fVar6 = *(float *)(lVar13 + -0x1c + lVar74);
                    fVar129 = *(float *)(lVar13 + -0x18 + lVar74);
                    fVar100 = *(float *)(lVar13 + -0x10 + lVar74);
                    fVar121 = fVar99 * fVar94 + fVar6 * fVar98 + fVar129 * fVar106;
                    fVar123 = fVar99 * fVar95 + fVar6 * fVar102 + fVar129 * fVar137;
                    fVar108 = *(float *)(lVar13 + -0xc + lVar74);
                    fVar92 = *(float *)(lVar13 + -8 + lVar74);
                    fVar105 = fVar100 * fVar138 + fVar108 * fVar96 + fVar92 * fVar103;
                    fVar107 = fVar100 * fVar93 + fVar108 * fVar97 + fVar92 * fVar136;
                    fVar109 = fVar100 * fVar94 + fVar108 * fVar98 + fVar92 * fVar106;
                    fVar111 = *(float *)(lVar13 + lVar74);
                    fVar130 = *(float *)(lVar13 + 4 + lVar74);
                    fVar135 = *(float *)(lVar13 + 8 + lVar74);
                    fVar100 = fVar100 * fVar95 + fVar108 * fVar102 + fVar92 * fVar137;
                    fVar79 = fVar113 * fVar95 + fVar128 * fVar102 + fVar79 * fVar137;
                    fVar128 = fVar111 * fVar138 + fVar130 * fVar96 + fVar135 * fVar103 +
                              (pAVar14->p).field_0.m128[0];
                    fVar108 = fVar111 * fVar93 + fVar130 * fVar97 + fVar135 * fVar136 +
                              (pAVar14->p).field_0.m128[1];
                    fVar92 = fVar111 * fVar94 + fVar130 * fVar98 + fVar135 * fVar106 +
                             (pAVar14->p).field_0.m128[2];
                    fVar111 = fVar111 * fVar95 + fVar130 * fVar102 + fVar135 * fVar137 +
                              (pAVar14->p).field_0.m128[3];
                    fVar113 = fVar99 * fVar138 + fVar6 * fVar96 + fVar129 * fVar103;
                    fVar99 = fVar99 * fVar93 + fVar6 * fVar97 + fVar129 * fVar136;
                  }
                  else if ((bVar10 == false) || (bVar11 == 0)) {
                    if ((bVar10 == false) || (bVar11 != 0)) {
                      if ((local_188 != 0.0) ||
                         ((((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))) ||
                          (uVar7 = *(undefined8 *)&(pAVar14->l).vz.field_0,
                          auVar31._4_4_ = -(uint)((pAVar14->l).vy.field_0.m128[0] != 0.0),
                          auVar31._0_4_ = -(uint)((pAVar14->l).vy.field_0.m128[2] != 0.0),
                          auVar31._8_4_ = -(uint)((float)uVar7 != 0.0),
                          auVar31._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                          uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar11),
                                            auVar31), (char)uVar59 != '\0')))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                   ,0x83);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                        std::ostream::put(-0x20);
                        std::ostream::flush();
                        psVar70 = extraout_RDX_15;
                      }
                      pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                      fVar79 = pfVar1[3];
                      pfVar2 = (float *)(lVar13 + -0x20 + lVar74);
                      fVar113 = *pfVar2;
                      fVar123 = pfVar2[3];
                      pfVar3 = (float *)(lVar13 + -0x10 + lVar74);
                      fVar105 = *pfVar3;
                      fVar107 = pfVar3[1];
                      fVar100 = pfVar3[3];
                      pfVar5 = (float *)(lVar13 + lVar74);
                      fVar128 = *pfVar5;
                      fVar108 = pfVar5[1];
                      fVar92 = pfVar5[2];
                      fVar111 = pfVar5[3];
                      uVar7 = *(undefined8 *)&(pAVar14->p).field_0;
                      fVar101 = (pAVar14->l).vx.field_0.m128[0] * *pfVar1;
                      local_188 = pfVar1[1] + (float)uVar7;
                      fVar104 = pfVar1[2] + (float)((ulong)uVar7 >> 0x20);
                      fVar121 = pfVar2[2] + (pAVar14->p).field_0.m128[2];
                      fVar99 = pfVar2[1] * (pAVar14->l).vy.field_0.m128[1];
                      fVar109 = pfVar3[2] * (pAVar14->l).vz.field_0.m128[2];
                      local_168.quaternion = true;
                    }
                    else {
                      local_a8 = ZEXT416((uint)(pAVar14->p).field_0.m128[3]);
                      local_108 = ZEXT416((uint)(pAVar14->l).vx.field_0.m128[3]);
                      local_b8 = ZEXT416((uint)(pAVar14->l).vz.field_0.m128[3]);
                      local_c8 = (pAVar14->l).vy.field_0.m128[0];
                      fStack_c4 = (pAVar14->l).vy.field_0.m128[1];
                      fStack_bc = (pAVar14->l).vy.field_0.m128[3];
                      local_d8 = (pAVar14->l).vz.field_0.m128[0];
                      fStack_d4 = (pAVar14->l).vz.field_0.m128[1];
                      fStack_d0 = (pAVar14->l).vz.field_0.m128[2];
                      fStack_cc = (pAVar14->l).vz.field_0.m128[3];
                      local_98 = *(undefined8 *)((long)&(pAVar14->l).vy.field_0 + 8);
                      uStack_90 = 0;
                      fVar79 = (pAVar14->l).vx.field_0.m128[0];
                      fStack_10c = (pAVar14->l).vx.field_0.m128[1];
                      pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                      fVar113 = *pfVar1;
                      fVar128 = pfVar1[1];
                      fVar123 = pfVar1[2];
                      pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
                      fVar105 = *pfVar1;
                      fVar107 = pfVar1[1];
                      fVar100 = pfVar1[2];
                      puVar4 = (undefined8 *)(lVar13 + -0x10 + lVar74);
                      local_e8 = *puVar4;
                      uStack_e0 = puVar4[1];
                      pfVar1 = (float *)(lVar13 + lVar74);
                      fVar108 = *pfVar1;
                      fVar92 = pfVar1[1];
                      fVar111 = pfVar1[2];
                      fVar101 = fVar113 * fVar79 + fVar128 * local_c8 + fVar123 * local_d8;
                      fVar99 = fVar113 * 0.0 + fVar128 * fStack_c4 + fVar123 * fStack_d4;
                      fVar113 = fVar113 * 0.0 + fVar128 * 0.0 + fVar123 * fStack_d0;
                      fStack_130 = fVar105 * 0.0 + fVar107 * 0.0 + fVar100 * fStack_d0;
                      fStack_12c = fVar105 * fStack_10c + fVar107 * fStack_bc + fVar100 * fStack_cc;
                      local_138 = (SubdivMeshNode *)
                                  CONCAT44(fVar105 * 0.0 + fVar107 * fStack_c4 + fVar100 * fStack_d4
                                           ,fVar105 * fVar79 +
                                            fVar107 * local_c8 + fVar100 * local_d8);
                      fStack_c0 = 0.0;
                      local_118 = (HairSetNode *)(ulong)(uint)fVar79;
                      fStack_110 = 0.0;
                      fStack_f0 = fVar108 * 0.0 + fVar92 * 0.0 + fVar111 * fStack_d0 +
                                  (pAVar14->p).field_0.m128[2];
                      fStack_ec = fVar108 * fStack_10c + fVar92 * fStack_bc + fVar111 * fStack_cc +
                                  (pAVar14->p).field_0.m128[3];
                      local_f8.upper =
                           fVar108 * 0.0 + fVar92 * fStack_c4 + fVar111 * fStack_d4 +
                           (pAVar14->p).field_0.m128[1];
                      local_f8.lower =
                           fVar108 * fVar79 + fVar92 * local_c8 + fVar111 * local_d8 +
                           (pAVar14->p).field_0.m128[0];
                      if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                          ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_130 != 0.0)))))) ||
                         (NAN(fStack_130))) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                   ,0x61);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                        std::ostream::put(-0x20);
                        std::ostream::flush();
                        psVar70 = extraout_RDX_14;
                      }
                      fVar105 = (float)local_118 * (float)local_e8 +
                                local_c8 * local_e8._4_4_ + local_d8 * (float)uStack_e0;
                      fVar107 = local_118._4_4_ * (float)local_e8 +
                                fStack_c4 * local_e8._4_4_ + fStack_d4 * (float)uStack_e0;
                      fVar109 = fStack_110 * (float)local_e8 +
                                fStack_c0 * local_e8._4_4_ + fStack_d0 * (float)uStack_e0;
                      local_168.quaternion = true;
                      fVar121 = (float)local_98;
                      fVar123 = (float)((ulong)local_98 >> 0x20);
                      fVar100 = (float)local_b8._0_4_;
                      fVar79 = (float)local_108._0_4_;
                      fVar128 = local_f8.lower;
                      fVar108 = local_f8.upper;
                      fVar92 = fStack_f0;
                      fVar111 = (float)local_a8._0_4_;
                      fVar113 = (float)local_138;
                      fVar99 = local_138._4_4_;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                               ,0x67);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                    std::ostream::put(-0x20);
                    std::ostream::flush();
                    fVar79 = (pAVar14->p).field_0.m128[3];
                    fVar104 = (pAVar14->l).vx.field_0.m128[3];
                    fVar113 = (pAVar14->l).vy.field_0.m128[3];
                    fVar128 = (pAVar14->l).vz.field_0.m128[3];
                    aVar8 = (pAVar14->l).vx.field_0.field_1;
                    fVar123 = (pAVar14->l).vy.field_0.m128[0];
                    fVar105 = (pAVar14->l).vy.field_0.m128[1];
                    fVar107 = (pAVar14->l).vz.field_0.m128[0];
                    fVar100 = (pAVar14->l).vz.field_0.m128[1];
                    fVar108 = (pAVar14->l).vz.field_0.m128[2];
                    fVar130 = fVar104 * fVar113 + fVar79 * fVar128;
                    fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
                    fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                              -fVar128 * fVar128;
                    fVar109 = fVar79 * fVar79 - fVar104 * fVar104;
                    fVar129 = fVar113 * fVar113 + fVar109 + -fVar128 * fVar128;
                    fVar138 = fVar104 * fVar128 - fVar79 * fVar113;
                    fVar92 = fVar79 * fVar113 + fVar104 * fVar128;
                    fVar135 = fVar113 * fVar128 + fVar79 * fVar104;
                    fVar79 = fVar113 * fVar128 - fVar79 * fVar104;
                    fVar111 = (pAVar14->p).field_0.m128[0];
                    fVar99 = (pAVar14->p).field_0.m128[1];
                    fVar6 = (pAVar14->p).field_0.m128[2];
                    fVar130 = fVar130 + fVar130;
                    fVar138 = fVar138 + fVar138;
                    fVar101 = fVar101 + fVar101;
                    fVar135 = fVar135 + fVar135;
                    fVar92 = fVar92 + fVar92;
                    fVar79 = fVar79 + fVar79;
                    fVar104 = fVar128 * fVar128 + fVar109 + -fVar113 * fVar113;
                    fVar117 = fVar121 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar119 = fVar121 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                    fVar122 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                    fVar124 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                    fVar112 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
                    fVar114 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
                    fVar115 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
                    fVar116 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
                    fVar135 = fVar92 * 1.0 + fVar79 * 0.0 + fVar104 * 0.0;
                    fVar93 = fVar92 * 0.0 + fVar79 * 1.0 + fVar104 * 0.0;
                    fVar95 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 1.0;
                    fVar97 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 0.0;
                    local_178 = aVar8.y;
                    fStack_174 = aVar8.z;
                    local_188 = aVar8.x;
                    fVar131 = local_188 * fVar117 + fVar112 * 0.0 + fVar135 * 0.0;
                    fVar132 = local_188 * fVar119 + fVar114 * 0.0 + fVar93 * 0.0;
                    fVar133 = local_188 * fVar122 + fVar115 * 0.0 + fVar95 * 0.0;
                    fVar134 = local_188 * fVar124 + fVar116 * 0.0 + fVar97 * 0.0;
                    fVar138 = fVar123 * fVar117 + fVar105 * fVar112 + fVar135 * 0.0;
                    fVar94 = fVar123 * fVar119 + fVar105 * fVar114 + fVar93 * 0.0;
                    fVar96 = fVar123 * fVar122 + fVar105 * fVar115 + fVar95 * 0.0;
                    fVar98 = fVar123 * fVar124 + fVar105 * fVar116 + fVar97 * 0.0;
                    fVar129 = fVar107 * fVar117 + fVar100 * fVar112 + fVar108 * fVar135;
                    fVar130 = fVar107 * fVar119 + fVar100 * fVar114 + fVar108 * fVar93;
                    fStack_130 = fVar107 * fVar122 + fVar100 * fVar115 + fVar108 * fVar95;
                    fStack_12c = fVar107 * fVar124 + fVar100 * fVar116 + fVar108 * fVar97;
                    local_138 = (SubdivMeshNode *)CONCAT44(fVar130,fVar129);
                    fVar79 = *(float *)(lVar13 + 0xc + lVar74);
                    fVar104 = *(float *)(lVar13 + -0x24 + lVar74);
                    fVar113 = *(float *)(lVar13 + -0x14 + lVar74);
                    fVar128 = *(float *)(lVar13 + -4 + lVar74);
                    fVar109 = fVar104 * fVar113 + fVar79 * fVar128;
                    fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
                    fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                              -fVar128 * fVar128;
                    fVar105 = fVar79 * fVar79 - fVar104 * fVar104;
                    fVar137 = fVar113 * fVar113 + fVar105 + -fVar128 * fVar128;
                    fVar136 = fVar104 * fVar128 - fVar79 * fVar113;
                    fVar106 = fVar79 * fVar113 + fVar104 * fVar128;
                    fVar139 = fVar113 * fVar128 + fVar79 * fVar104;
                    fVar92 = fVar113 * fVar128 - fVar79 * fVar104;
                    pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                    fVar79 = *pfVar1;
                    pfVar2 = (float *)(lVar13 + -0x20 + lVar74);
                    fVar104 = *pfVar2;
                    fVar123 = pfVar2[1];
                    fVar125 = fVar128 * fVar128 + fVar105 + -fVar113 * fVar113;
                    pfVar3 = (float *)(lVar13 + -0x10 + lVar74);
                    fVar113 = *pfVar3;
                    fVar128 = pfVar3[1];
                    fVar105 = pfVar3[2];
                    fVar109 = fVar109 + fVar109;
                    fVar136 = fVar136 + fVar136;
                    pfVar3 = (float *)(lVar13 + lVar74);
                    fVar107 = *pfVar3;
                    fVar100 = pfVar3[1];
                    fVar108 = pfVar3[2];
                    fVar102 = fVar121 * 1.0 + fVar109 * 0.0 + fVar136 * 0.0;
                    fVar103 = fVar121 * 0.0 + fVar109 * 1.0 + fVar136 * 0.0;
                    fVar136 = fVar121 * 0.0 + fVar109 * 0.0 + fVar136 * 1.0;
                    fVar101 = fVar101 + fVar101;
                    fVar139 = fVar139 + fVar139;
                    fVar106 = fVar106 + fVar106;
                    fVar92 = fVar92 + fVar92;
                    fVar121 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                    fVar109 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                    fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                    fVar137 = fVar106 * 1.0 + fVar92 * 0.0 + fVar125 * 0.0;
                    fVar139 = fVar106 * 0.0 + fVar92 * 1.0 + fVar125 * 0.0;
                    fVar92 = fVar106 * 0.0 + fVar92 * 0.0 + fVar125 * 1.0;
                    fVar118 = fVar79 * fVar102 + fVar121 * 0.0 + fVar137 * 0.0;
                    fVar120 = fVar79 * fVar103 + fVar109 * 0.0 + fVar139 * 0.0;
                    fVar79 = fVar79 * fVar136 + fVar101 * 0.0 + fVar92 * 0.0;
                    fVar106 = fVar104 * fVar102 + fVar123 * fVar121 + fVar137 * 0.0;
                    fVar125 = fVar104 * fVar103 + fVar123 * fVar109 + fVar139 * 0.0;
                    fVar110 = fVar104 * fVar136 + fVar123 * fVar101 + fVar92 * 0.0;
                    fVar126 = fVar113 * fVar102 + fVar128 * fVar121 + fVar105 * fVar137;
                    fVar127 = fVar113 * fVar103 + fVar128 * fVar109 + fVar105 * fVar139;
                    fVar128 = fVar113 * fVar136 + fVar128 * fVar101 + fVar105 * fVar92;
                    fVar113 = fVar107 * fVar102 + fVar100 * fVar121 + fVar108 * fVar137 +
                              pfVar1[1] + 0.0;
                    fVar102 = fVar107 * fVar103 + fVar100 * fVar109 + fVar108 * fVar139 +
                              pfVar1[2] + 0.0;
                    fVar103 = fVar107 * fVar136 + fVar100 * fVar101 + fVar108 * fVar92 +
                              pfVar2[2] + 0.0;
                    fVar101 = fVar118 * fVar131 + fVar120 * fVar138 + fVar79 * fVar129;
                    local_188 = fVar118 * fVar132 + fVar120 * fVar94 + fVar79 * fVar130;
                    fVar104 = fVar118 * fVar133 + fVar120 * fVar96 + fVar79 * fStack_130;
                    fVar121 = fVar106 * fVar133 + fVar125 * fVar96 + fVar110 * fStack_130;
                    fVar123 = fVar106 * fVar134 + fVar125 * fVar98 + fVar110 * fStack_12c;
                    fVar105 = fVar126 * fVar131 + fVar127 * fVar138 + fVar128 * fVar129;
                    fVar107 = fVar126 * fVar132 + fVar127 * fVar94 + fVar128 * fVar130;
                    fVar109 = fVar126 * fVar133 + fVar127 * fVar96 + fVar128 * fStack_130;
                    psVar70 = extraout_RDX_13;
                    fVar100 = fVar126 * fVar134 + fVar127 * fVar98 + fVar128 * fStack_12c;
                    fVar79 = fVar118 * fVar134 + fVar120 * fVar98 + fVar79 * fStack_12c;
                    fVar128 = fVar113 * fVar131 + fVar102 * fVar138 + fVar103 * fVar129 +
                              fVar111 * fVar117 + fVar99 * fVar112 + fVar6 * fVar135 +
                              local_178 + 0.0;
                    fVar108 = fVar113 * fVar132 + fVar102 * fVar94 + fVar103 * fVar130 +
                              fVar111 * fVar119 + fVar99 * fVar114 + fVar6 * fVar93 +
                              fStack_174 + 0.0;
                    fVar92 = fVar113 * fVar133 + fVar102 * fVar96 + fVar103 * fStack_130 +
                             fVar111 * fVar122 + fVar99 * fVar115 + fVar6 * fVar95 +
                             (pAVar14->l).vy.field_0.m128[2] + 0.0;
                    fVar111 = fVar113 * fVar134 + fVar102 * fVar98 + fVar103 * fStack_12c +
                              fVar111 * fVar124 + fVar99 * fVar116 + fVar6 * fVar97 + 0.0;
                    fVar113 = fVar106 * fVar131 + fVar125 * fVar138 + fVar110 * fVar129;
                    fVar99 = fVar106 * fVar132 + fVar125 * fVar94 + fVar110 * fVar130;
                  }
                }
                else {
                  auVar28._4_4_ = -(uint)((pAVar14->l).vy.field_0.m128[0] != 0.0);
                  auVar28._0_4_ = -(uint)((pAVar14->l).vx.field_0.m128[3] != 0.0);
                  auVar28._8_4_ = -(uint)((pAVar14->l).vy.field_0.m128[1] != 1.0);
                  auVar28._12_4_ = -(uint)((pAVar14->l).vy.field_0.m128[2] != 0.0);
                  uVar75 = movmskps(uVar75,auVar28);
                  if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                     (((uVar75 & 4) != 0 ||
                      (bVar69 = ((byte)uVar75 & 8) >> 3,
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                  goto LAB_001634f8;
                  auVar29._4_4_ = -(uint)((pAVar14->l).vz.field_0.m128[0] != 0.0);
                  auVar29._0_4_ = -(uint)((pAVar14->l).vy.field_0.m128[3] != 0.0);
                  auVar29._8_4_ = -(uint)((pAVar14->l).vz.field_0.m128[1] != 0.0);
                  auVar29._12_4_ = -(uint)((pAVar14->l).vz.field_0.m128[2] != 1.0);
                  uVar75 = movmskps(uVar75,auVar29);
                  if (((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                      ((uVar75 & 4) != 0)) ||
                     (bVar69 = ((byte)uVar75 & 8) >> 3,
                     uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0)) goto LAB_001634f8;
                  auVar30._4_4_ = -(uint)((pAVar14->p).field_0.m128[0] != 0.0);
                  auVar30._0_4_ = -(uint)((pAVar14->l).vz.field_0.m128[3] != 0.0);
                  auVar30._8_4_ = -(uint)((pAVar14->p).field_0.m128[1] != 0.0);
                  auVar30._12_4_ = -(uint)((pAVar14->p).field_0.m128[2] != 0.0);
                  uVar75 = movmskps(uVar75,auVar30);
                  if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)
                     ) goto LAB_001634f8;
                  bVar69 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                  psVar70 = (size_t *)(ulong)uVar75;
                  if ((bVar69 != 0) ||
                     ((bVar10 != false &&
                      ((fVar79 = (pAVar14->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
                  goto LAB_001634f8;
                  pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                  fVar101 = *pfVar1;
                  local_188 = pfVar1[1];
                  fVar104 = pfVar1[2];
                  fVar79 = pfVar1[3];
                  pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
                  fVar113 = *pfVar1;
                  fVar99 = pfVar1[1];
                  fVar121 = pfVar1[2];
                  fVar123 = pfVar1[3];
                  pfVar1 = (float *)(lVar13 + -0x10 + lVar74);
                  fVar105 = *pfVar1;
                  fVar107 = pfVar1[1];
                  fVar109 = pfVar1[2];
                  fVar100 = pfVar1[3];
                  pfVar1 = (float *)(lVar13 + lVar74);
                  fVar128 = *pfVar1;
                  fVar108 = pfVar1[1];
                  fVar92 = pfVar1[2];
                  fVar111 = pfVar1[3];
                  local_168.quaternion = (bool)bVar11;
                }
LAB_00163fce:
                pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x30);
                *pfVar1 = fVar101;
                pfVar1[1] = local_188;
                pfVar1[2] = fVar104;
                pfVar1[3] = fVar79;
                pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x20);
                *pfVar1 = fVar113;
                pfVar1[1] = fVar99;
                pfVar1[2] = fVar121;
                pfVar1[3] = fVar123;
                pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x10);
                *pfVar1 = fVar105;
                pfVar1[1] = fVar107;
                pfVar1[2] = fVar109;
                pfVar1[3] = fVar100;
                pfVar1 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar74);
                *pfVar1 = fVar128;
                pfVar1[1] = fVar108;
                pfVar1[2] = fVar92;
                pfVar1[3] = fVar111;
                uVar71 = uVar71 + 1;
                lVar74 = lVar74 + 0x40;
                pAVar61 = local_168.spaces.items;
              } while (uVar71 < *(ulong *)&(pLVar73->vy).field_0);
            }
          }
          else {
            sVar15 = *(size_t *)&(pLVar73->vy).field_0;
            if (sVar15 == 1) {
              fVar79 = (spaces->time_range).lower;
              fVar104 = (spaces->time_range).upper;
              uVar7 = *(undefined8 *)&(pLVar73->vx).field_0;
              fVar113 = (float)uVar7;
              fVar128 = (float)((ulong)uVar7 >> 0x20);
              uVar75 = -(uint)(fVar79 < fVar113);
              uVar77 = -(uint)(fVar104 < fVar128);
              local_168.time_range.upper = (float)(~uVar77 & (uint)fVar128 | (uint)fVar104 & uVar77)
              ;
              local_168.time_range.lower = (float)(~uVar75 & (uint)fVar79 | (uint)fVar113 & uVar75);
              local_168.spaces.size_active = 0;
              local_168.spaces.size_alloced = 0;
              local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar12 != 0) {
                local_168.spaces.items =
                     (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                     alignedMalloc(sVar12 << 6,0x10);
                psVar70 = extraout_RDX_16;
                local_168.spaces.size_alloced = sVar12;
              }
              pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
              if (spaces->quaternion == false) {
                pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                          (ulong)(uint)(pLVar73->vz).field_0.m128[2];
              }
              local_168.quaternion = SUB81(pAVar61,0);
              local_168.spaces.size_active = local_168.spaces.size_alloced;
              if ((spaces->spaces).size_active != 0) {
                lVar74 = 0x30;
                uVar71 = 0;
                do {
                  uVar75 = (uint)psVar70;
                  pAVar14 = (spaces->spaces).items;
                  pfVar1 = *(float **)&(pLVar73->vz).field_0;
                  bVar10 = spaces->quaternion;
                  bVar11 = *(byte *)((long)&(pLVar73->vz).field_0 + 8);
                  local_168.quaternion = false;
                  fVar79 = *(float *)((long)pAVar14 + lVar74 + -0x30);
                  uVar7 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x2c);
                  fVar104 = (float)((ulong)uVar7 >> 0x20);
                  local_188 = (float)uVar7;
                  if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_188 != 0.0)) ||
                     (((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))))) {
LAB_001641cf:
                    fVar113 = (float)*(undefined8 *)pfVar1;
                    fVar128 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
                    iVar76 = -(uint)(fVar113 != 1.0);
                    iVar78 = -(uint)(fVar128 != 0.0);
                    auVar89._4_4_ = iVar78;
                    auVar89._0_4_ = iVar76;
                    auVar89._8_4_ = iVar78;
                    auVar89._12_4_ = iVar78;
                    auVar88._8_8_ = auVar89._8_8_;
                    auVar88._4_4_ = iVar76;
                    auVar88._0_4_ = iVar76;
                    uVar75 = movmskpd(uVar75,auVar88);
                    psVar70 = (size_t *)(ulong)uVar75;
                    fVar79 = pfVar1[2];
                    if ((uVar75 & 1) == 0) {
                      bVar69 = (byte)uVar75 >> 1;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      psVar70 = (size_t *)(ulong)uVar75;
                      if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                        auVar52._4_4_ = -(uint)(pfVar1[4] != 0.0);
                        auVar52._0_4_ = -(uint)(pfVar1[3] != 0.0);
                        auVar52._8_4_ = -(uint)(pfVar1[5] != 1.0);
                        auVar52._12_4_ = -(uint)(pfVar1[6] != 0.0);
                        uVar75 = movmskps(uVar75,auVar52);
                        psVar70 = (size_t *)(ulong)uVar75;
                        if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar69 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                          psVar70 = (size_t *)(ulong)uVar75;
                          if (bVar69 == 0) {
                            auVar53._4_4_ = -(uint)(pfVar1[8] != 0.0);
                            auVar53._0_4_ = -(uint)(pfVar1[7] != 0.0);
                            auVar53._8_4_ = -(uint)(pfVar1[9] != 0.0);
                            auVar53._12_4_ = -(uint)(pfVar1[10] != 1.0);
                            uVar75 = movmskps(uVar75,auVar53);
                            psVar70 = (size_t *)(ulong)uVar75;
                            if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                               ((uVar75 & 4) == 0)) {
                              bVar69 = ((byte)uVar75 & 8) >> 3;
                              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                              psVar70 = (size_t *)(ulong)uVar75;
                              if (bVar69 == 0) {
                                auVar54._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                                auVar54._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                                auVar54._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                                auVar54._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                                uVar75 = movmskps(uVar75,auVar54);
                                psVar70 = (size_t *)(ulong)uVar75;
                                if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                     ((uVar75 & 4) == 0)) &&
                                    (bVar69 = ((byte)uVar75 & 8) >> 3,
                                    psVar70 = (size_t *)(ulong)CONCAT31((int3)(uVar75 >> 8),bVar69),
                                    bVar69 == 0)) &&
                                   ((bVar11 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf])))))))
                                {
                                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                                  fVar101 = *pfVar1;
                                  local_188 = pfVar1[1];
                                  fVar104 = pfVar1[2];
                                  fVar79 = pfVar1[3];
                                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                                  fVar113 = *pfVar1;
                                  fVar99 = pfVar1[1];
                                  fVar121 = pfVar1[2];
                                  fVar123 = pfVar1[3];
                                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                                  fVar105 = *pfVar1;
                                  fVar107 = pfVar1[1];
                                  fVar109 = pfVar1[2];
                                  fVar100 = pfVar1[3];
                                  pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                                  fVar128 = *pfVar1;
                                  fVar108 = pfVar1[1];
                                  fVar92 = pfVar1[2];
                                  fVar111 = pfVar1[3];
                                  local_168.quaternion = bVar10;
                                  goto LAB_00164ca2;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if ((bVar10 == false) && (bVar11 == 0)) {
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x30);
                      fVar138 = *pfVar2;
                      fVar93 = pfVar2[1];
                      fVar94 = pfVar2[2];
                      fVar95 = pfVar2[3];
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      fVar96 = *pfVar2;
                      fVar97 = pfVar2[1];
                      fVar98 = pfVar2[2];
                      fVar102 = pfVar2[3];
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x10);
                      fVar103 = *pfVar2;
                      fVar136 = pfVar2[1];
                      fVar106 = pfVar2[2];
                      fVar137 = pfVar2[3];
                      fVar101 = fVar113 * fVar138 + fVar128 * fVar96 + fVar79 * fVar103;
                      local_188 = fVar113 * fVar93 + fVar128 * fVar97 + fVar79 * fVar136;
                      fVar104 = fVar113 * fVar94 + fVar128 * fVar98 + fVar79 * fVar106;
                      fVar99 = pfVar1[4];
                      fVar6 = pfVar1[5];
                      fVar129 = pfVar1[6];
                      fVar100 = pfVar1[8];
                      fVar121 = fVar99 * fVar94 + fVar6 * fVar98 + fVar129 * fVar106;
                      fVar123 = fVar99 * fVar95 + fVar6 * fVar102 + fVar129 * fVar137;
                      fVar108 = pfVar1[9];
                      fVar92 = pfVar1[10];
                      fVar105 = fVar100 * fVar138 + fVar108 * fVar96 + fVar92 * fVar103;
                      fVar107 = fVar100 * fVar93 + fVar108 * fVar97 + fVar92 * fVar136;
                      fVar109 = fVar100 * fVar94 + fVar108 * fVar98 + fVar92 * fVar106;
                      fVar111 = pfVar1[0xc];
                      fVar130 = pfVar1[0xd];
                      fVar135 = pfVar1[0xe];
                      pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar100 = fVar100 * fVar95 + fVar108 * fVar102 + fVar92 * fVar137;
                      fVar79 = fVar113 * fVar95 + fVar128 * fVar102 + fVar79 * fVar137;
                      fVar128 = fVar111 * fVar138 + fVar130 * fVar96 + fVar135 * fVar103 + *pfVar1;
                      fVar108 = fVar111 * fVar93 + fVar130 * fVar97 + fVar135 * fVar136 + pfVar1[1];
                      fVar92 = fVar111 * fVar94 + fVar130 * fVar98 + fVar135 * fVar106 + pfVar1[2];
                      fVar111 = fVar111 * fVar95 + fVar130 * fVar102 + fVar135 * fVar137 + pfVar1[3]
                      ;
                      fVar113 = fVar99 * fVar138 + fVar6 * fVar96 + fVar129 * fVar103;
                      fVar99 = fVar99 * fVar93 + fVar6 * fVar97 + fVar129 * fVar136;
                    }
                    else if ((bVar10 == false) || (bVar11 == 0)) {
                      if ((bVar10 == false) || (bVar11 != 0)) {
                        if ((local_188 != 0.0) ||
                           ((((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))) ||
                            (uVar7 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x10),
                            auVar35._4_4_ =
                                 -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x20) != 0.0),
                            auVar35._0_4_ =
                                 -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x18) != 0.0),
                            auVar35._8_4_ = -(uint)((float)uVar7 != 0.0),
                            auVar35._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                            uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar11),
                                              auVar35), (char)uVar59 != '\0')))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                          std::ostream::put(-0x20);
                          std::ostream::flush();
                          psVar70 = extraout_RDX_19;
                        }
                        fVar79 = pfVar1[3];
                        fVar113 = pfVar1[4];
                        fVar123 = pfVar1[7];
                        fVar105 = pfVar1[8];
                        fVar107 = pfVar1[9];
                        fVar100 = pfVar1[0xb];
                        fVar128 = pfVar1[0xc];
                        fVar108 = pfVar1[0xd];
                        fVar92 = pfVar1[0xe];
                        fVar111 = pfVar1[0xf];
                        uVar7 = *(undefined8 *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                        fVar101 = *(float *)((long)pAVar14 + lVar74 + -0x30) * *pfVar1;
                        local_188 = pfVar1[1] + (float)uVar7;
                        fVar104 = pfVar1[2] + (float)((ulong)uVar7 >> 0x20);
                        fVar121 = pfVar1[6] +
                                  *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 8);
                        fVar99 = pfVar1[5] * *(float *)((long)pAVar14 + lVar74 + -0x1c);
                        fVar109 = pfVar1[10] * *(float *)((long)pAVar14 + lVar74 + -8);
                        local_168.quaternion = true;
                      }
                      else {
                        local_a8 = ZEXT416(*(uint *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc))
                        ;
                        local_108 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -0x24));
                        local_b8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -4));
                        pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                        local_c8 = *pfVar2;
                        fStack_c4 = pfVar2[1];
                        fStack_bc = pfVar2[3];
                        pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x10);
                        local_d8 = *pfVar2;
                        fStack_d4 = pfVar2[1];
                        fStack_d0 = pfVar2[2];
                        fStack_cc = pfVar2[3];
                        local_98 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x18);
                        uStack_90 = 0;
                        pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x30);
                        fVar79 = *pfVar2;
                        fStack_10c = pfVar2[1];
                        fVar113 = *pfVar1;
                        fVar128 = pfVar1[1];
                        fVar123 = pfVar1[2];
                        fVar105 = pfVar1[4];
                        fVar107 = pfVar1[5];
                        fVar100 = pfVar1[6];
                        local_e8 = *(undefined8 *)(pfVar1 + 8);
                        uStack_e0 = *(undefined8 *)(pfVar1 + 10);
                        fVar108 = pfVar1[0xc];
                        fVar92 = pfVar1[0xd];
                        fVar111 = pfVar1[0xe];
                        fVar101 = fVar113 * fVar79 + fVar128 * local_c8 + fVar123 * local_d8;
                        fVar99 = fVar113 * 0.0 + fVar128 * fStack_c4 + fVar123 * fStack_d4;
                        fVar113 = fVar113 * 0.0 + fVar128 * 0.0 + fVar123 * fStack_d0;
                        fStack_130 = fVar105 * 0.0 + fVar107 * 0.0 + fVar100 * fStack_d0;
                        fStack_12c = fVar105 * fStack_10c +
                                     fVar107 * fStack_bc + fVar100 * fStack_cc;
                        local_138 = (SubdivMeshNode *)
                                    CONCAT44(fVar105 * 0.0 +
                                             fVar107 * fStack_c4 + fVar100 * fStack_d4,
                                             fVar105 * fVar79 +
                                             fVar107 * local_c8 + fVar100 * local_d8);
                        fStack_c0 = 0.0;
                        local_118 = (HairSetNode *)(ulong)(uint)fVar79;
                        fStack_110 = 0.0;
                        pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                        fStack_f0 = fVar108 * 0.0 + fVar92 * 0.0 + fVar111 * fStack_d0 + pfVar1[2];
                        fStack_ec = fVar108 * fStack_10c + fVar92 * fStack_bc + fVar111 * fStack_cc
                                    + pfVar1[3];
                        local_f8.upper =
                             fVar108 * 0.0 + fVar92 * fStack_c4 + fVar111 * fStack_d4 + pfVar1[1];
                        local_f8.lower =
                             fVar108 * fVar79 + fVar92 * local_c8 + fVar111 * local_d8 + *pfVar1;
                        if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                            ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_130 != 0.0)))))) ||
                           (NAN(fStack_130))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                          std::ostream::put(-0x20);
                          std::ostream::flush();
                          psVar70 = extraout_RDX_18;
                        }
                        fVar105 = (float)local_118 * (float)local_e8 +
                                  local_c8 * local_e8._4_4_ + local_d8 * (float)uStack_e0;
                        fVar107 = local_118._4_4_ * (float)local_e8 +
                                  fStack_c4 * local_e8._4_4_ + fStack_d4 * (float)uStack_e0;
                        fVar109 = fStack_110 * (float)local_e8 +
                                  fStack_c0 * local_e8._4_4_ + fStack_d0 * (float)uStack_e0;
                        local_168.quaternion = true;
                        fVar121 = (float)local_98;
                        fVar123 = (float)((ulong)local_98 >> 0x20);
                        fVar100 = (float)local_b8._0_4_;
                        fVar79 = (float)local_108._0_4_;
                        fVar128 = local_f8.lower;
                        fVar108 = local_f8.upper;
                        fVar92 = fStack_f0;
                        fVar111 = (float)local_a8._0_4_;
                        fVar113 = (float)local_138;
                        fVar99 = local_138._4_4_;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                      std::ostream::put(-0x20);
                      std::ostream::flush();
                      fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc);
                      fVar104 = *(float *)((long)pAVar14 + lVar74 + -0x24);
                      fVar113 = *(float *)((long)pAVar14 + lVar74 + -0x14);
                      fVar128 = *(float *)((long)pAVar14 + lVar74 + -4);
                      auVar9 = *(undefined1 (*) [16])((long)pAVar14 + lVar74 + -0x30);
                      pfVar3 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      fVar123 = *pfVar3;
                      fVar105 = pfVar3[1];
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x10);
                      fVar107 = *pfVar2;
                      fVar100 = pfVar2[1];
                      fVar108 = pfVar2[2];
                      fVar130 = fVar104 * fVar113 + fVar79 * fVar128;
                      fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
                      fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                                -fVar128 * fVar128;
                      fVar109 = fVar79 * fVar79 - fVar104 * fVar104;
                      fVar129 = fVar113 * fVar113 + fVar109 + -fVar128 * fVar128;
                      fVar138 = fVar104 * fVar128 - fVar79 * fVar113;
                      fVar92 = fVar79 * fVar113 + fVar104 * fVar128;
                      fVar135 = fVar113 * fVar128 + fVar79 * fVar104;
                      fVar79 = fVar113 * fVar128 - fVar79 * fVar104;
                      pfVar2 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar111 = *pfVar2;
                      fVar99 = pfVar2[1];
                      fVar6 = pfVar2[2];
                      fVar130 = fVar130 + fVar130;
                      fVar138 = fVar138 + fVar138;
                      fVar101 = fVar101 + fVar101;
                      fVar135 = fVar135 + fVar135;
                      fVar92 = fVar92 + fVar92;
                      fVar79 = fVar79 + fVar79;
                      fVar104 = fVar128 * fVar128 + fVar109 + -fVar113 * fVar113;
                      fVar117 = fVar121 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar119 = fVar121 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                      fVar122 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                      fVar124 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar112 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
                      fVar114 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
                      fVar115 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
                      fVar116 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
                      fVar135 = fVar92 * 1.0 + fVar79 * 0.0 + fVar104 * 0.0;
                      fVar93 = fVar92 * 0.0 + fVar79 * 1.0 + fVar104 * 0.0;
                      fVar95 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 1.0;
                      fVar97 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 0.0;
                      local_178 = auVar9._4_4_;
                      fStack_174 = auVar9._8_4_;
                      local_188 = auVar9._0_4_;
                      fVar131 = local_188 * fVar117 + fVar112 * 0.0 + fVar135 * 0.0;
                      fVar132 = local_188 * fVar119 + fVar114 * 0.0 + fVar93 * 0.0;
                      fVar133 = local_188 * fVar122 + fVar115 * 0.0 + fVar95 * 0.0;
                      fVar134 = local_188 * fVar124 + fVar116 * 0.0 + fVar97 * 0.0;
                      fVar138 = fVar123 * fVar117 + fVar105 * fVar112 + fVar135 * 0.0;
                      fVar94 = fVar123 * fVar119 + fVar105 * fVar114 + fVar93 * 0.0;
                      fVar96 = fVar123 * fVar122 + fVar105 * fVar115 + fVar95 * 0.0;
                      fVar98 = fVar123 * fVar124 + fVar105 * fVar116 + fVar97 * 0.0;
                      fVar129 = fVar107 * fVar117 + fVar100 * fVar112 + fVar108 * fVar135;
                      fVar130 = fVar107 * fVar119 + fVar100 * fVar114 + fVar108 * fVar93;
                      fStack_130 = fVar107 * fVar122 + fVar100 * fVar115 + fVar108 * fVar95;
                      fStack_12c = fVar107 * fVar124 + fVar100 * fVar116 + fVar108 * fVar97;
                      local_138 = (SubdivMeshNode *)CONCAT44(fVar130,fVar129);
                      fVar79 = pfVar1[0xf];
                      fVar104 = pfVar1[3];
                      fVar113 = pfVar1[7];
                      fVar128 = pfVar1[0xb];
                      fVar109 = fVar104 * fVar113 + fVar79 * fVar128;
                      fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
                      fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                                -fVar128 * fVar128;
                      fVar105 = fVar79 * fVar79 - fVar104 * fVar104;
                      fVar137 = fVar113 * fVar113 + fVar105 + -fVar128 * fVar128;
                      fVar136 = fVar104 * fVar128 - fVar79 * fVar113;
                      fVar106 = fVar79 * fVar113 + fVar104 * fVar128;
                      fVar139 = fVar113 * fVar128 + fVar79 * fVar104;
                      fVar92 = fVar113 * fVar128 - fVar79 * fVar104;
                      fVar79 = *pfVar1;
                      fVar104 = pfVar1[4];
                      fVar123 = pfVar1[5];
                      fVar125 = fVar128 * fVar128 + fVar105 + -fVar113 * fVar113;
                      fVar113 = pfVar1[8];
                      fVar128 = pfVar1[9];
                      fVar105 = pfVar1[10];
                      fVar109 = fVar109 + fVar109;
                      fVar136 = fVar136 + fVar136;
                      fVar107 = pfVar1[0xc];
                      fVar100 = pfVar1[0xd];
                      fVar108 = pfVar1[0xe];
                      fVar102 = fVar121 * 1.0 + fVar109 * 0.0 + fVar136 * 0.0;
                      fVar103 = fVar121 * 0.0 + fVar109 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar121 * 0.0 + fVar109 * 0.0 + fVar136 * 1.0;
                      fVar101 = fVar101 + fVar101;
                      fVar139 = fVar139 + fVar139;
                      fVar106 = fVar106 + fVar106;
                      fVar92 = fVar92 + fVar92;
                      fVar121 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar109 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar106 * 1.0 + fVar92 * 0.0 + fVar125 * 0.0;
                      fVar139 = fVar106 * 0.0 + fVar92 * 1.0 + fVar125 * 0.0;
                      fVar92 = fVar106 * 0.0 + fVar92 * 0.0 + fVar125 * 1.0;
                      fVar118 = fVar79 * fVar102 + fVar121 * 0.0 + fVar137 * 0.0;
                      fVar120 = fVar79 * fVar103 + fVar109 * 0.0 + fVar139 * 0.0;
                      fVar79 = fVar79 * fVar136 + fVar101 * 0.0 + fVar92 * 0.0;
                      fVar106 = fVar104 * fVar102 + fVar123 * fVar121 + fVar137 * 0.0;
                      fVar125 = fVar104 * fVar103 + fVar123 * fVar109 + fVar139 * 0.0;
                      fVar110 = fVar104 * fVar136 + fVar123 * fVar101 + fVar92 * 0.0;
                      fVar126 = fVar113 * fVar102 + fVar128 * fVar121 + fVar105 * fVar137;
                      fVar127 = fVar113 * fVar103 + fVar128 * fVar109 + fVar105 * fVar139;
                      fVar128 = fVar113 * fVar136 + fVar128 * fVar101 + fVar105 * fVar92;
                      fVar113 = fVar107 * fVar102 + fVar100 * fVar121 + fVar108 * fVar137 +
                                pfVar1[1] + 0.0;
                      fVar102 = fVar107 * fVar103 + fVar100 * fVar109 + fVar108 * fVar139 +
                                pfVar1[2] + 0.0;
                      fVar103 = fVar107 * fVar136 + fVar100 * fVar101 + fVar108 * fVar92 +
                                pfVar1[6] + 0.0;
                      fVar101 = fVar118 * fVar131 + fVar120 * fVar138 + fVar79 * fVar129;
                      local_188 = fVar118 * fVar132 + fVar120 * fVar94 + fVar79 * fVar130;
                      fVar104 = fVar118 * fVar133 + fVar120 * fVar96 + fVar79 * fStack_130;
                      fVar121 = fVar106 * fVar133 + fVar125 * fVar96 + fVar110 * fStack_130;
                      fVar123 = fVar106 * fVar134 + fVar125 * fVar98 + fVar110 * fStack_12c;
                      fVar105 = fVar126 * fVar131 + fVar127 * fVar138 + fVar128 * fVar129;
                      fVar107 = fVar126 * fVar132 + fVar127 * fVar94 + fVar128 * fVar130;
                      fVar109 = fVar126 * fVar133 + fVar127 * fVar96 + fVar128 * fStack_130;
                      psVar70 = extraout_RDX_17;
                      fVar100 = fVar126 * fVar134 + fVar127 * fVar98 + fVar128 * fStack_12c;
                      fVar79 = fVar118 * fVar134 + fVar120 * fVar98 + fVar79 * fStack_12c;
                      fVar128 = fVar113 * fVar131 + fVar102 * fVar138 + fVar103 * fVar129 +
                                fVar111 * fVar117 + fVar99 * fVar112 + fVar6 * fVar135 +
                                local_178 + 0.0;
                      fVar108 = fVar113 * fVar132 + fVar102 * fVar94 + fVar103 * fVar130 +
                                fVar111 * fVar119 + fVar99 * fVar114 + fVar6 * fVar93 +
                                fStack_174 + 0.0;
                      fVar92 = fVar113 * fVar133 + fVar102 * fVar96 + fVar103 * fStack_130 +
                               fVar111 * fVar122 + fVar99 * fVar115 + fVar6 * fVar95 +
                               pfVar3[2] + 0.0;
                      fVar111 = fVar113 * fVar134 + fVar102 * fVar98 + fVar103 * fStack_12c +
                                fVar111 * fVar124 + fVar99 * fVar116 + fVar6 * fVar97 + 0.0;
                      fVar113 = fVar106 * fVar131 + fVar125 * fVar138 + fVar110 * fVar129;
                      fVar99 = fVar106 * fVar132 + fVar125 * fVar94 + fVar110 * fVar130;
                    }
                  }
                  else {
                    pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x24);
                    auVar32._4_4_ = -(uint)(pfVar2[1] != 0.0);
                    auVar32._0_4_ = -(uint)(*pfVar2 != 0.0);
                    auVar32._8_4_ = -(uint)(pfVar2[2] != 1.0);
                    auVar32._12_4_ = -(uint)(pfVar2[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar32);
                    if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       (((uVar75 & 4) != 0 ||
                        (bVar69 = ((byte)uVar75 & 8) >> 3,
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                    goto LAB_001641cf;
                    pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x14);
                    auVar33._4_4_ = -(uint)(pfVar2[1] != 0.0);
                    auVar33._0_4_ = -(uint)(*pfVar2 != 0.0);
                    auVar33._8_4_ = -(uint)(pfVar2[2] != 0.0);
                    auVar33._12_4_ = -(uint)(pfVar2[3] != 1.0);
                    uVar75 = movmskps(uVar75,auVar33);
                    if (((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                        ((uVar75 & 4) != 0)) ||
                       (bVar69 = ((byte)uVar75 & 8) >> 3,
                       uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))
                    goto LAB_001641cf;
                    pfVar2 = (float *)((long)pAVar14 + lVar74 + -4);
                    auVar34._4_4_ = -(uint)(pfVar2[1] != 0.0);
                    auVar34._0_4_ = -(uint)(*pfVar2 != 0.0);
                    auVar34._8_4_ = -(uint)(pfVar2[2] != 0.0);
                    auVar34._12_4_ = -(uint)(pfVar2[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar34);
                    if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       ((uVar75 & 4) != 0)) goto LAB_001641cf;
                    bVar69 = ((byte)uVar75 & 8) >> 3;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    psVar70 = (size_t *)(ulong)uVar75;
                    if ((bVar69 != 0) ||
                       ((bVar10 != false &&
                        ((fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc),
                         fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_001641cf;
                    fVar101 = *pfVar1;
                    local_188 = pfVar1[1];
                    fVar104 = pfVar1[2];
                    fVar79 = pfVar1[3];
                    fVar113 = pfVar1[4];
                    fVar99 = pfVar1[5];
                    fVar121 = pfVar1[6];
                    fVar123 = pfVar1[7];
                    fVar105 = pfVar1[8];
                    fVar107 = pfVar1[9];
                    fVar109 = pfVar1[10];
                    fVar100 = pfVar1[0xb];
                    fVar128 = pfVar1[0xc];
                    fVar108 = pfVar1[0xd];
                    fVar92 = pfVar1[0xe];
                    fVar111 = pfVar1[0xf];
                    local_168.quaternion = (bool)bVar11;
                  }
LAB_00164ca2:
                  pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x30);
                  *pfVar1 = fVar101;
                  pfVar1[1] = local_188;
                  pfVar1[2] = fVar104;
                  pfVar1[3] = fVar79;
                  pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x20);
                  *pfVar1 = fVar113;
                  pfVar1[1] = fVar99;
                  pfVar1[2] = fVar121;
                  pfVar1[3] = fVar123;
                  pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x10);
                  *pfVar1 = fVar105;
                  pfVar1[1] = fVar107;
                  pfVar1[2] = fVar109;
                  pfVar1[3] = fVar100;
                  pfVar1 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar74);
                  *pfVar1 = fVar128;
                  pfVar1[1] = fVar108;
                  pfVar1[2] = fVar92;
                  pfVar1[3] = fVar111;
                  uVar71 = uVar71 + 1;
                  lVar74 = lVar74 + 0x40;
                  pAVar61 = local_168.spaces.items;
                } while (uVar71 < (spaces->spaces).size_active);
              }
            }
            else {
              if (sVar12 != sVar15) {
                prVar68 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar68,"number of transformations does not match");
                __cxa_throw(prVar68,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              fVar79 = (spaces->time_range).lower;
              fVar104 = (spaces->time_range).upper;
              uVar7 = *(undefined8 *)&(pLVar73->vx).field_0;
              fVar113 = (float)uVar7;
              fVar128 = (float)((ulong)uVar7 >> 0x20);
              uVar75 = -(uint)(fVar79 < fVar113);
              uVar77 = -(uint)(fVar104 < fVar128);
              local_168.time_range.upper = (float)(~uVar77 & (uint)fVar128 | (uint)fVar104 & uVar77)
              ;
              local_168.time_range.lower = (float)(~uVar75 & (uint)fVar79 | (uint)fVar113 & uVar75);
              local_168.spaces.size_active = 0;
              local_168.spaces.size_alloced = 0;
              local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
              if (sVar12 != 0) {
                local_168.spaces.items =
                     (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                     alignedMalloc(sVar12 << 6,0x10);
                psVar70 = extraout_RDX_20;
                local_168.spaces.size_alloced = sVar12;
              }
              pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
              if (spaces->quaternion == false) {
                pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                          (ulong)(uint)(pLVar73->vz).field_0.m128[2];
              }
              local_168.quaternion = SUB81(pAVar61,0);
              local_168.spaces.size_active = local_168.spaces.size_alloced;
              if ((spaces->spaces).size_active != 0) {
                lVar74 = 0x30;
                uVar71 = 0;
                do {
                  uVar75 = (uint)psVar70;
                  pAVar14 = (spaces->spaces).items;
                  lVar13 = *(long *)&(pLVar73->vz).field_0;
                  bVar10 = spaces->quaternion;
                  bVar11 = *(byte *)((long)&(pLVar73->vz).field_0 + 8);
                  local_168.quaternion = false;
                  fVar79 = *(float *)((long)pAVar14 + lVar74 + -0x30);
                  uVar7 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x2c);
                  fVar104 = (float)((ulong)uVar7 >> 0x20);
                  local_188 = (float)uVar7;
                  if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_188 != 0.0)) ||
                     (((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))))) {
LAB_00164e9e:
                    uVar7 = *(undefined8 *)(lVar13 + -0x30 + lVar74);
                    fVar113 = (float)uVar7;
                    fVar128 = (float)((ulong)uVar7 >> 0x20);
                    iVar76 = -(uint)(fVar113 != 1.0);
                    iVar78 = -(uint)(fVar128 != 0.0);
                    auVar91._4_4_ = iVar78;
                    auVar91._0_4_ = iVar76;
                    auVar91._8_4_ = iVar78;
                    auVar91._12_4_ = iVar78;
                    auVar90._8_8_ = auVar91._8_8_;
                    auVar90._4_4_ = iVar76;
                    auVar90._0_4_ = iVar76;
                    uVar75 = movmskpd(uVar75,auVar90);
                    psVar70 = (size_t *)(ulong)uVar75;
                    fVar79 = *(float *)(lVar13 + -0x28 + lVar74);
                    if ((uVar75 & 1) == 0) {
                      bVar69 = (byte)uVar75 >> 1;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      psVar70 = (size_t *)(ulong)uVar75;
                      if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                        pfVar1 = (float *)(lVar13 + -0x24 + lVar74);
                        auVar55._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar55._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar55._8_4_ = -(uint)(pfVar1[2] != 1.0);
                        auVar55._12_4_ = -(uint)(pfVar1[3] != 0.0);
                        uVar75 = movmskps(uVar75,auVar55);
                        psVar70 = (size_t *)(ulong)uVar75;
                        if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                           ((uVar75 & 4) == 0)) {
                          bVar69 = ((byte)uVar75 & 8) >> 3;
                          uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                          psVar70 = (size_t *)(ulong)uVar75;
                          if (bVar69 == 0) {
                            pfVar1 = (float *)(lVar13 + -0x14 + lVar74);
                            auVar56._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar56._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar56._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar56._12_4_ = -(uint)(pfVar1[3] != 1.0);
                            uVar75 = movmskps(uVar75,auVar56);
                            psVar70 = (size_t *)(ulong)uVar75;
                            if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                               ((uVar75 & 4) == 0)) {
                              bVar69 = ((byte)uVar75 & 8) >> 3;
                              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                              psVar70 = (size_t *)(ulong)uVar75;
                              if (bVar69 == 0) {
                                pfVar1 = (float *)(lVar13 + -4 + lVar74);
                                auVar57._4_4_ = -(uint)(pfVar1[1] != 0.0);
                                auVar57._0_4_ = -(uint)(*pfVar1 != 0.0);
                                auVar57._8_4_ = -(uint)(pfVar1[2] != 0.0);
                                auVar57._12_4_ = -(uint)(pfVar1[3] != 0.0);
                                uVar75 = movmskps(uVar75,auVar57);
                                psVar70 = (size_t *)(ulong)uVar75;
                                if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                                     ((uVar75 & 4) == 0)) &&
                                    (bVar69 = ((byte)uVar75 & 8) >> 3,
                                    psVar70 = (size_t *)(ulong)CONCAT31((int3)(uVar75 >> 8),bVar69),
                                    bVar69 == 0)) &&
                                   ((bVar11 == 0 ||
                                    ((fVar123 = *(float *)(lVar13 + 0xc + lVar74), fVar123 == 1.0 &&
                                     (!NAN(fVar123))))))) {
                                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                                  fVar101 = *pfVar1;
                                  local_188 = pfVar1[1];
                                  fVar104 = pfVar1[2];
                                  fVar79 = pfVar1[3];
                                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                                  fVar113 = *pfVar1;
                                  fVar99 = pfVar1[1];
                                  fVar121 = pfVar1[2];
                                  fVar123 = pfVar1[3];
                                  pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                                  fVar105 = *pfVar1;
                                  fVar107 = pfVar1[1];
                                  fVar109 = pfVar1[2];
                                  fVar100 = pfVar1[3];
                                  pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                                  fVar128 = *pfVar1;
                                  fVar108 = pfVar1[1];
                                  fVar92 = pfVar1[2];
                                  fVar111 = pfVar1[3];
                                  local_168.quaternion = bVar10;
                                  goto LAB_00165994;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if ((bVar10 == false) && (bVar11 == 0)) {
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                      fVar138 = *pfVar1;
                      fVar93 = pfVar1[1];
                      fVar94 = pfVar1[2];
                      fVar95 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      fVar96 = *pfVar1;
                      fVar97 = pfVar1[1];
                      fVar98 = pfVar1[2];
                      fVar102 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                      fVar103 = *pfVar1;
                      fVar136 = pfVar1[1];
                      fVar106 = pfVar1[2];
                      fVar137 = pfVar1[3];
                      fVar101 = fVar113 * fVar138 + fVar128 * fVar96 + fVar79 * fVar103;
                      local_188 = fVar113 * fVar93 + fVar128 * fVar97 + fVar79 * fVar136;
                      fVar104 = fVar113 * fVar94 + fVar128 * fVar98 + fVar79 * fVar106;
                      fVar99 = *(float *)(lVar13 + -0x20 + lVar74);
                      fVar6 = *(float *)(lVar13 + -0x1c + lVar74);
                      fVar129 = *(float *)(lVar13 + -0x18 + lVar74);
                      fVar100 = *(float *)(lVar13 + -0x10 + lVar74);
                      fVar121 = fVar99 * fVar94 + fVar6 * fVar98 + fVar129 * fVar106;
                      fVar123 = fVar99 * fVar95 + fVar6 * fVar102 + fVar129 * fVar137;
                      fVar108 = *(float *)(lVar13 + -0xc + lVar74);
                      fVar92 = *(float *)(lVar13 + -8 + lVar74);
                      fVar105 = fVar100 * fVar138 + fVar108 * fVar96 + fVar92 * fVar103;
                      fVar107 = fVar100 * fVar93 + fVar108 * fVar97 + fVar92 * fVar136;
                      fVar109 = fVar100 * fVar94 + fVar108 * fVar98 + fVar92 * fVar106;
                      fVar111 = *(float *)(lVar13 + lVar74);
                      fVar130 = *(float *)(lVar13 + 4 + lVar74);
                      fVar135 = *(float *)(lVar13 + 8 + lVar74);
                      pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar100 = fVar100 * fVar95 + fVar108 * fVar102 + fVar92 * fVar137;
                      fVar79 = fVar113 * fVar95 + fVar128 * fVar102 + fVar79 * fVar137;
                      fVar128 = fVar111 * fVar138 + fVar130 * fVar96 + fVar135 * fVar103 + *pfVar1;
                      fVar108 = fVar111 * fVar93 + fVar130 * fVar97 + fVar135 * fVar136 + pfVar1[1];
                      fVar92 = fVar111 * fVar94 + fVar130 * fVar98 + fVar135 * fVar106 + pfVar1[2];
                      fVar111 = fVar111 * fVar95 + fVar130 * fVar102 + fVar135 * fVar137 + pfVar1[3]
                      ;
                      fVar113 = fVar99 * fVar138 + fVar6 * fVar96 + fVar129 * fVar103;
                      fVar99 = fVar99 * fVar93 + fVar6 * fVar97 + fVar129 * fVar136;
                    }
                    else if ((bVar10 == false) || (bVar11 == 0)) {
                      if ((bVar10 == false) || (bVar11 != 0)) {
                        if ((local_188 != 0.0) ||
                           ((((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))) ||
                            (uVar7 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x10),
                            auVar39._4_4_ =
                                 -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x20) != 0.0),
                            auVar39._0_4_ =
                                 -(uint)(*(float *)((long)pAVar14 + lVar74 + -0x18) != 0.0),
                            auVar39._8_4_ = -(uint)((float)uVar7 != 0.0),
                            auVar39._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                            uVar59 = movmskps((int)CONCAT71((int7)((ulong)pAVar61 >> 8),bVar11),
                                              auVar39), (char)uVar59 != '\0')))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                          std::ostream::put(-0x20);
                          std::ostream::flush();
                          psVar70 = extraout_RDX_23;
                        }
                        pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                        fVar79 = pfVar1[3];
                        pfVar2 = (float *)(lVar13 + -0x20 + lVar74);
                        fVar113 = *pfVar2;
                        fVar123 = pfVar2[3];
                        pfVar3 = (float *)(lVar13 + -0x10 + lVar74);
                        fVar105 = *pfVar3;
                        fVar107 = pfVar3[1];
                        fVar100 = pfVar3[3];
                        pfVar5 = (float *)(lVar13 + lVar74);
                        fVar128 = *pfVar5;
                        fVar108 = pfVar5[1];
                        fVar92 = pfVar5[2];
                        fVar111 = pfVar5[3];
                        uVar7 = *(undefined8 *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                        fVar101 = *(float *)((long)pAVar14 + lVar74 + -0x30) * *pfVar1;
                        local_188 = pfVar1[1] + (float)uVar7;
                        fVar104 = pfVar1[2] + (float)((ulong)uVar7 >> 0x20);
                        fVar121 = pfVar2[2] +
                                  *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 8);
                        fVar99 = pfVar2[1] * *(float *)((long)pAVar14 + lVar74 + -0x1c);
                        fVar109 = pfVar3[2] * *(float *)((long)pAVar14 + lVar74 + -8);
                        local_168.quaternion = true;
                      }
                      else {
                        local_a8 = ZEXT416(*(uint *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc))
                        ;
                        local_108 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -0x24));
                        local_b8 = ZEXT416(*(uint *)((long)pAVar14 + lVar74 + -4));
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x20);
                        local_c8 = *pfVar1;
                        fStack_c4 = pfVar1[1];
                        fStack_bc = pfVar1[3];
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                        local_d8 = *pfVar1;
                        fStack_d4 = pfVar1[1];
                        fStack_d0 = pfVar1[2];
                        fStack_cc = pfVar1[3];
                        local_98 = *(undefined8 *)((long)pAVar14 + lVar74 + -0x18);
                        uStack_90 = 0;
                        pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x30);
                        fVar79 = *pfVar1;
                        fStack_10c = pfVar1[1];
                        pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                        fVar113 = *pfVar1;
                        fVar128 = pfVar1[1];
                        fVar123 = pfVar1[2];
                        pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
                        fVar105 = *pfVar1;
                        fVar107 = pfVar1[1];
                        fVar100 = pfVar1[2];
                        puVar4 = (undefined8 *)(lVar13 + -0x10 + lVar74);
                        local_e8 = *puVar4;
                        uStack_e0 = puVar4[1];
                        pfVar1 = (float *)(lVar13 + lVar74);
                        fVar108 = *pfVar1;
                        fVar92 = pfVar1[1];
                        fVar111 = pfVar1[2];
                        fVar101 = fVar113 * fVar79 + fVar128 * local_c8 + fVar123 * local_d8;
                        fVar99 = fVar113 * 0.0 + fVar128 * fStack_c4 + fVar123 * fStack_d4;
                        fVar113 = fVar113 * 0.0 + fVar128 * 0.0 + fVar123 * fStack_d0;
                        fStack_130 = fVar105 * 0.0 + fVar107 * 0.0 + fVar100 * fStack_d0;
                        fStack_12c = fVar105 * fStack_10c +
                                     fVar107 * fStack_bc + fVar100 * fStack_cc;
                        local_138 = (SubdivMeshNode *)
                                    CONCAT44(fVar105 * 0.0 +
                                             fVar107 * fStack_c4 + fVar100 * fStack_d4,
                                             fVar105 * fVar79 +
                                             fVar107 * local_c8 + fVar100 * local_d8);
                        fStack_c0 = 0.0;
                        local_118 = (HairSetNode *)(ulong)(uint)fVar79;
                        fStack_110 = 0.0;
                        pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                        fStack_f0 = fVar108 * 0.0 + fVar92 * 0.0 + fVar111 * fStack_d0 + pfVar1[2];
                        fStack_ec = fVar108 * fStack_10c + fVar92 * fStack_bc + fVar111 * fStack_cc
                                    + pfVar1[3];
                        local_f8.upper =
                             fVar108 * 0.0 + fVar92 * fStack_c4 + fVar111 * fStack_d4 + pfVar1[1];
                        local_f8.lower =
                             fVar108 * fVar79 + fVar92 * local_c8 + fVar111 * local_d8 + *pfVar1;
                        if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                            ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_130 != 0.0)))))) ||
                           (NAN(fStack_130))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                          std::ostream::put(-0x20);
                          std::ostream::flush();
                          psVar70 = extraout_RDX_22;
                        }
                        fVar105 = (float)local_118 * (float)local_e8 +
                                  local_c8 * local_e8._4_4_ + local_d8 * (float)uStack_e0;
                        fVar107 = local_118._4_4_ * (float)local_e8 +
                                  fStack_c4 * local_e8._4_4_ + fStack_d4 * (float)uStack_e0;
                        fVar109 = fStack_110 * (float)local_e8 +
                                  fStack_c0 * local_e8._4_4_ + fStack_d0 * (float)uStack_e0;
                        local_168.quaternion = true;
                        fVar121 = (float)local_98;
                        fVar123 = (float)((ulong)local_98 >> 0x20);
                        fVar100 = (float)local_b8._0_4_;
                        fVar79 = (float)local_108._0_4_;
                        fVar128 = local_f8.lower;
                        fVar108 = local_f8.upper;
                        fVar92 = fStack_f0;
                        fVar111 = (float)local_a8._0_4_;
                        fVar113 = (float)local_138;
                        fVar99 = local_138._4_4_;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                      std::ostream::put(-0x20);
                      std::ostream::flush();
                      fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc);
                      fVar104 = *(float *)((long)pAVar14 + lVar74 + -0x24);
                      fVar113 = *(float *)((long)pAVar14 + lVar74 + -0x14);
                      fVar128 = *(float *)((long)pAVar14 + lVar74 + -4);
                      auVar9 = *(undefined1 (*) [16])((long)pAVar14 + lVar74 + -0x30);
                      pfVar2 = (float *)((long)pAVar14 + lVar74 + -0x20);
                      fVar123 = *pfVar2;
                      fVar105 = pfVar2[1];
                      pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x10);
                      fVar107 = *pfVar1;
                      fVar100 = pfVar1[1];
                      fVar108 = pfVar1[2];
                      fVar130 = fVar104 * fVar113 + fVar79 * fVar128;
                      fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
                      fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                                -fVar128 * fVar128;
                      fVar109 = fVar79 * fVar79 - fVar104 * fVar104;
                      fVar129 = fVar113 * fVar113 + fVar109 + -fVar128 * fVar128;
                      fVar138 = fVar104 * fVar128 - fVar79 * fVar113;
                      fVar92 = fVar79 * fVar113 + fVar104 * fVar128;
                      fVar135 = fVar113 * fVar128 + fVar79 * fVar104;
                      fVar79 = fVar113 * fVar128 - fVar79 * fVar104;
                      pfVar1 = (float *)((long)&(pAVar14->l).vx.field_0 + lVar74);
                      fVar111 = *pfVar1;
                      fVar99 = pfVar1[1];
                      fVar6 = pfVar1[2];
                      fVar130 = fVar130 + fVar130;
                      fVar138 = fVar138 + fVar138;
                      fVar101 = fVar101 + fVar101;
                      fVar135 = fVar135 + fVar135;
                      fVar92 = fVar92 + fVar92;
                      fVar79 = fVar79 + fVar79;
                      fVar104 = fVar128 * fVar128 + fVar109 + -fVar113 * fVar113;
                      fVar117 = fVar121 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar119 = fVar121 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
                      fVar122 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
                      fVar124 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
                      fVar112 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
                      fVar114 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
                      fVar115 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
                      fVar116 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
                      fVar135 = fVar92 * 1.0 + fVar79 * 0.0 + fVar104 * 0.0;
                      fVar93 = fVar92 * 0.0 + fVar79 * 1.0 + fVar104 * 0.0;
                      fVar95 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 1.0;
                      fVar97 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 0.0;
                      local_178 = auVar9._4_4_;
                      fStack_174 = auVar9._8_4_;
                      local_188 = auVar9._0_4_;
                      fVar131 = local_188 * fVar117 + fVar112 * 0.0 + fVar135 * 0.0;
                      fVar132 = local_188 * fVar119 + fVar114 * 0.0 + fVar93 * 0.0;
                      fVar133 = local_188 * fVar122 + fVar115 * 0.0 + fVar95 * 0.0;
                      fVar134 = local_188 * fVar124 + fVar116 * 0.0 + fVar97 * 0.0;
                      fVar138 = fVar123 * fVar117 + fVar105 * fVar112 + fVar135 * 0.0;
                      fVar94 = fVar123 * fVar119 + fVar105 * fVar114 + fVar93 * 0.0;
                      fVar96 = fVar123 * fVar122 + fVar105 * fVar115 + fVar95 * 0.0;
                      fVar98 = fVar123 * fVar124 + fVar105 * fVar116 + fVar97 * 0.0;
                      fVar129 = fVar107 * fVar117 + fVar100 * fVar112 + fVar108 * fVar135;
                      fVar130 = fVar107 * fVar119 + fVar100 * fVar114 + fVar108 * fVar93;
                      fStack_130 = fVar107 * fVar122 + fVar100 * fVar115 + fVar108 * fVar95;
                      fStack_12c = fVar107 * fVar124 + fVar100 * fVar116 + fVar108 * fVar97;
                      local_138 = (SubdivMeshNode *)CONCAT44(fVar130,fVar129);
                      fVar79 = *(float *)(lVar13 + 0xc + lVar74);
                      fVar104 = *(float *)(lVar13 + -0x24 + lVar74);
                      fVar113 = *(float *)(lVar13 + -0x14 + lVar74);
                      fVar128 = *(float *)(lVar13 + -4 + lVar74);
                      fVar109 = fVar104 * fVar113 + fVar79 * fVar128;
                      fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
                      fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                                -fVar128 * fVar128;
                      fVar105 = fVar79 * fVar79 - fVar104 * fVar104;
                      fVar137 = fVar113 * fVar113 + fVar105 + -fVar128 * fVar128;
                      fVar136 = fVar104 * fVar128 - fVar79 * fVar113;
                      fVar106 = fVar79 * fVar113 + fVar104 * fVar128;
                      fVar139 = fVar113 * fVar128 + fVar79 * fVar104;
                      fVar92 = fVar113 * fVar128 - fVar79 * fVar104;
                      pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                      fVar79 = *pfVar1;
                      pfVar3 = (float *)(lVar13 + -0x20 + lVar74);
                      fVar104 = *pfVar3;
                      fVar123 = pfVar3[1];
                      fVar125 = fVar128 * fVar128 + fVar105 + -fVar113 * fVar113;
                      pfVar5 = (float *)(lVar13 + -0x10 + lVar74);
                      fVar113 = *pfVar5;
                      fVar128 = pfVar5[1];
                      fVar105 = pfVar5[2];
                      fVar109 = fVar109 + fVar109;
                      fVar136 = fVar136 + fVar136;
                      pfVar5 = (float *)(lVar13 + lVar74);
                      fVar107 = *pfVar5;
                      fVar100 = pfVar5[1];
                      fVar108 = pfVar5[2];
                      fVar102 = fVar121 * 1.0 + fVar109 * 0.0 + fVar136 * 0.0;
                      fVar103 = fVar121 * 0.0 + fVar109 * 1.0 + fVar136 * 0.0;
                      fVar136 = fVar121 * 0.0 + fVar109 * 0.0 + fVar136 * 1.0;
                      fVar101 = fVar101 + fVar101;
                      fVar139 = fVar139 + fVar139;
                      fVar106 = fVar106 + fVar106;
                      fVar92 = fVar92 + fVar92;
                      fVar121 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
                      fVar109 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
                      fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
                      fVar137 = fVar106 * 1.0 + fVar92 * 0.0 + fVar125 * 0.0;
                      fVar139 = fVar106 * 0.0 + fVar92 * 1.0 + fVar125 * 0.0;
                      fVar92 = fVar106 * 0.0 + fVar92 * 0.0 + fVar125 * 1.0;
                      fVar118 = fVar79 * fVar102 + fVar121 * 0.0 + fVar137 * 0.0;
                      fVar120 = fVar79 * fVar103 + fVar109 * 0.0 + fVar139 * 0.0;
                      fVar79 = fVar79 * fVar136 + fVar101 * 0.0 + fVar92 * 0.0;
                      fVar106 = fVar104 * fVar102 + fVar123 * fVar121 + fVar137 * 0.0;
                      fVar125 = fVar104 * fVar103 + fVar123 * fVar109 + fVar139 * 0.0;
                      fVar110 = fVar104 * fVar136 + fVar123 * fVar101 + fVar92 * 0.0;
                      fVar126 = fVar113 * fVar102 + fVar128 * fVar121 + fVar105 * fVar137;
                      fVar127 = fVar113 * fVar103 + fVar128 * fVar109 + fVar105 * fVar139;
                      fVar128 = fVar113 * fVar136 + fVar128 * fVar101 + fVar105 * fVar92;
                      fVar113 = fVar107 * fVar102 + fVar100 * fVar121 + fVar108 * fVar137 +
                                pfVar1[1] + 0.0;
                      fVar102 = fVar107 * fVar103 + fVar100 * fVar109 + fVar108 * fVar139 +
                                pfVar1[2] + 0.0;
                      fVar103 = fVar107 * fVar136 + fVar100 * fVar101 + fVar108 * fVar92 +
                                pfVar3[2] + 0.0;
                      fVar101 = fVar118 * fVar131 + fVar120 * fVar138 + fVar79 * fVar129;
                      local_188 = fVar118 * fVar132 + fVar120 * fVar94 + fVar79 * fVar130;
                      fVar104 = fVar118 * fVar133 + fVar120 * fVar96 + fVar79 * fStack_130;
                      fVar121 = fVar106 * fVar133 + fVar125 * fVar96 + fVar110 * fStack_130;
                      fVar123 = fVar106 * fVar134 + fVar125 * fVar98 + fVar110 * fStack_12c;
                      fVar105 = fVar126 * fVar131 + fVar127 * fVar138 + fVar128 * fVar129;
                      fVar107 = fVar126 * fVar132 + fVar127 * fVar94 + fVar128 * fVar130;
                      fVar109 = fVar126 * fVar133 + fVar127 * fVar96 + fVar128 * fStack_130;
                      psVar70 = extraout_RDX_21;
                      fVar100 = fVar126 * fVar134 + fVar127 * fVar98 + fVar128 * fStack_12c;
                      fVar79 = fVar118 * fVar134 + fVar120 * fVar98 + fVar79 * fStack_12c;
                      fVar128 = fVar113 * fVar131 + fVar102 * fVar138 + fVar103 * fVar129 +
                                fVar111 * fVar117 + fVar99 * fVar112 + fVar6 * fVar135 +
                                local_178 + 0.0;
                      fVar108 = fVar113 * fVar132 + fVar102 * fVar94 + fVar103 * fVar130 +
                                fVar111 * fVar119 + fVar99 * fVar114 + fVar6 * fVar93 +
                                fStack_174 + 0.0;
                      fVar92 = fVar113 * fVar133 + fVar102 * fVar96 + fVar103 * fStack_130 +
                               fVar111 * fVar122 + fVar99 * fVar115 + fVar6 * fVar95 +
                               pfVar2[2] + 0.0;
                      fVar111 = fVar113 * fVar134 + fVar102 * fVar98 + fVar103 * fStack_12c +
                                fVar111 * fVar124 + fVar99 * fVar116 + fVar6 * fVar97 + 0.0;
                      fVar113 = fVar106 * fVar131 + fVar125 * fVar138 + fVar110 * fVar129;
                      fVar99 = fVar106 * fVar132 + fVar125 * fVar94 + fVar110 * fVar130;
                    }
                  }
                  else {
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x24);
                    auVar36._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar36._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar36._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar36._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar36);
                    if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       (((uVar75 & 4) != 0 ||
                        (bVar69 = ((byte)uVar75 & 8) >> 3,
                        uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))))
                    goto LAB_00164e9e;
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -0x14);
                    auVar37._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar37._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar37._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar37._12_4_ = -(uint)(pfVar1[3] != 1.0);
                    uVar75 = movmskps(uVar75,auVar37);
                    if (((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                        ((uVar75 & 4) != 0)) ||
                       (bVar69 = ((byte)uVar75 & 8) >> 3,
                       uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 != 0))
                    goto LAB_00164e9e;
                    pfVar1 = (float *)((long)pAVar14 + lVar74 + -4);
                    auVar38._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar38._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar38._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar38._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar75 = movmskps(uVar75,auVar38);
                    if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
                       ((uVar75 & 4) != 0)) goto LAB_00164e9e;
                    bVar69 = ((byte)uVar75 & 8) >> 3;
                    uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                    psVar70 = (size_t *)(ulong)uVar75;
                    if ((bVar69 != 0) ||
                       ((bVar10 != false &&
                        ((fVar79 = *(float *)((long)&(pAVar14->l).vx.field_0 + lVar74 + 0xc),
                         fVar79 != 1.0 || (NAN(fVar79))))))) goto LAB_00164e9e;
                    pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                    fVar101 = *pfVar1;
                    local_188 = pfVar1[1];
                    fVar104 = pfVar1[2];
                    fVar79 = pfVar1[3];
                    pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
                    fVar113 = *pfVar1;
                    fVar99 = pfVar1[1];
                    fVar121 = pfVar1[2];
                    fVar123 = pfVar1[3];
                    pfVar1 = (float *)(lVar13 + -0x10 + lVar74);
                    fVar105 = *pfVar1;
                    fVar107 = pfVar1[1];
                    fVar109 = pfVar1[2];
                    fVar100 = pfVar1[3];
                    pfVar1 = (float *)(lVar13 + lVar74);
                    fVar128 = *pfVar1;
                    fVar108 = pfVar1[1];
                    fVar92 = pfVar1[2];
                    fVar111 = pfVar1[3];
                    local_168.quaternion = (bool)bVar11;
                  }
LAB_00165994:
                  pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x30);
                  *pfVar1 = fVar101;
                  pfVar1[1] = local_188;
                  pfVar1[2] = fVar104;
                  pfVar1[3] = fVar79;
                  pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x20);
                  *pfVar1 = fVar113;
                  pfVar1[1] = fVar99;
                  pfVar1[2] = fVar121;
                  pfVar1[3] = fVar123;
                  pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x10);
                  *pfVar1 = fVar105;
                  pfVar1[1] = fVar107;
                  pfVar1[2] = fVar109;
                  pfVar1[3] = fVar100;
                  pfVar1 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar74);
                  *pfVar1 = fVar128;
                  pfVar1[1] = fVar108;
                  pfVar1[2] = fVar92;
                  pfVar1[3] = fVar111;
                  uVar71 = uVar71 + 1;
                  lVar74 = lVar74 + 0x40;
                  pAVar61 = local_168.spaces.items;
                } while (uVar71 < (spaces->spaces).size_active);
              }
            }
          }
          convertGeometries(local_78,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                      *)local_120,local_40,&local_168);
          alignedFree(local_168.spaces.items);
          local_168.spaces.size_active = 0;
          local_168.spaces.size_alloced = 0;
          local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          uVar71 = local_38 + 1;
          pAVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)local_80[0xd];
          plVar60 = local_88;
        } while (uVar71 < (ulong)((local_80[0xe] - (long)pAVar61 >> 4) * -0x5555555555555555));
      }
    }
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 0x18))();
    }
  }
  else {
    (**(code **)(*plVar60 + 0x10))(plVar60);
    sVar12 = (spaces->spaces).size_active;
    if (sVar12 == 1) {
      fVar79 = (spaces->time_range).lower;
      fVar104 = (spaces->time_range).upper;
      fVar113 = (float)plVar60[0xd];
      fVar128 = (float)((ulong)plVar60[0xd] >> 0x20);
      uVar75 = -(uint)(fVar79 < fVar113);
      uVar77 = -(uint)(fVar104 < fVar128);
      sVar12 = plVar60[0xf];
      local_168.time_range.upper = (float)(~uVar77 & (uint)fVar128 | (uint)fVar104 & uVar77);
      local_168.time_range.lower = (float)(~uVar75 & (uint)fVar79 | (uint)fVar113 & uVar75);
      local_168.spaces.size_active = 0;
      local_168.spaces.size_alloced = 0;
      local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      uVar71 = extraout_RDX;
      if (sVar12 != 0) {
        local_168.spaces.items =
             (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar12 << 6,0x10);
        uVar71 = extraout_RDX_00;
        local_168.spaces.size_alloced = sVar12;
      }
      local_168.quaternion = false;
      local_168.spaces.size_active = local_168.spaces.size_alloced;
      if (plVar60[0xf] != 0) {
        lVar74 = 0x30;
        uVar72 = 0;
        do {
          uVar75 = (uint)uVar71;
          pAVar61 = (spaces->spaces).items;
          lVar13 = plVar60[0x11];
          bVar10 = spaces->quaternion;
          bVar11 = *(byte *)(plVar60 + 0x12);
          local_168.quaternion = false;
          fVar79 = (pAVar61->l).vx.field_0.m128[0];
          uVar7 = *(undefined8 *)((long)&(pAVar61->l).vx.field_0 + 4);
          fVar104 = (float)((ulong)uVar7 >> 0x20);
          local_188 = (float)uVar7;
          if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_188 != 0.0)) ||
             (((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))))) {
LAB_00160e04:
            uVar7 = *(undefined8 *)(lVar13 + -0x30 + lVar74);
            fVar113 = (float)uVar7;
            fVar128 = (float)((ulong)uVar7 >> 0x20);
            iVar76 = -(uint)(fVar113 != 1.0);
            iVar78 = -(uint)(fVar128 != 0.0);
            auVar81._4_4_ = iVar78;
            auVar81._0_4_ = iVar76;
            auVar81._8_4_ = iVar78;
            auVar81._12_4_ = iVar78;
            auVar80._8_8_ = auVar81._8_8_;
            auVar80._4_4_ = iVar76;
            auVar80._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar80);
            uVar71 = (ulong)uVar75;
            fVar79 = *(float *)(lVar13 + -0x28 + lVar74);
            if ((uVar75 & 1) == 0) {
              bVar69 = (byte)uVar75 >> 1;
              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
              uVar71 = (ulong)uVar75;
              if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                pfVar1 = (float *)(lVar13 + -0x24 + lVar74);
                auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar40._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar40._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar75 = movmskps(uVar75,auVar40);
                uVar71 = (ulong)uVar75;
                if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) && ((uVar75 & 4) == 0))
                {
                  bVar69 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                  uVar71 = (ulong)uVar75;
                  if (bVar69 == 0) {
                    pfVar1 = (float *)(lVar13 + -0x14 + lVar74);
                    auVar41._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar41._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar41._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar41._12_4_ = -(uint)(pfVar1[3] != 1.0);
                    uVar75 = movmskps(uVar75,auVar41);
                    uVar71 = (ulong)uVar75;
                    if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) {
                      bVar69 = ((byte)uVar75 & 8) >> 3;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      uVar71 = (ulong)uVar75;
                      if (bVar69 == 0) {
                        pfVar1 = (float *)(lVar13 + -4 + lVar74);
                        auVar42._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar42._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar42._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar42._12_4_ = -(uint)(pfVar1[3] != 0.0);
                        uVar75 = movmskps(uVar75,auVar42);
                        uVar71 = (ulong)uVar75;
                        if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar75 & 8) >> 3,
                            uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar11 == 0 ||
                            ((fVar123 = *(float *)(lVar13 + 0xc + lVar74), fVar123 == 1.0 &&
                             (!NAN(fVar123))))))) {
                          fVar101 = (pAVar61->l).vx.field_0.m128[0];
                          local_188 = (pAVar61->l).vx.field_0.m128[1];
                          fVar104 = (pAVar61->l).vx.field_0.m128[2];
                          fVar79 = (pAVar61->l).vx.field_0.m128[3];
                          fVar113 = (pAVar61->l).vy.field_0.m128[0];
                          fVar99 = (pAVar61->l).vy.field_0.m128[1];
                          fVar121 = (pAVar61->l).vy.field_0.m128[2];
                          fVar123 = (pAVar61->l).vy.field_0.m128[3];
                          fVar105 = (pAVar61->l).vz.field_0.m128[0];
                          fVar107 = (pAVar61->l).vz.field_0.m128[1];
                          fVar109 = (pAVar61->l).vz.field_0.m128[2];
                          fVar100 = (pAVar61->l).vz.field_0.m128[3];
                          fVar128 = (pAVar61->p).field_0.m128[0];
                          fVar108 = (pAVar61->p).field_0.m128[1];
                          fVar92 = (pAVar61->p).field_0.m128[2];
                          fVar111 = (pAVar61->p).field_0.m128[3];
                          local_168.quaternion = bVar10;
                          goto LAB_001618c8;
                        }
                      }
                    }
                  }
                }
              }
            }
            if ((bVar10 == false) && (bVar11 == 0)) {
              fVar138 = (pAVar61->l).vx.field_0.m128[0];
              fVar93 = (pAVar61->l).vx.field_0.m128[1];
              fVar94 = (pAVar61->l).vx.field_0.m128[2];
              fVar95 = (pAVar61->l).vx.field_0.m128[3];
              fVar96 = (pAVar61->l).vy.field_0.m128[0];
              fVar97 = (pAVar61->l).vy.field_0.m128[1];
              fVar98 = (pAVar61->l).vy.field_0.m128[2];
              fVar102 = (pAVar61->l).vy.field_0.m128[3];
              fVar103 = (pAVar61->l).vz.field_0.m128[0];
              fVar136 = (pAVar61->l).vz.field_0.m128[1];
              fVar106 = (pAVar61->l).vz.field_0.m128[2];
              fVar137 = (pAVar61->l).vz.field_0.m128[3];
              fVar101 = fVar113 * fVar138 + fVar128 * fVar96 + fVar79 * fVar103;
              local_188 = fVar113 * fVar93 + fVar128 * fVar97 + fVar79 * fVar136;
              fVar104 = fVar113 * fVar94 + fVar128 * fVar98 + fVar79 * fVar106;
              fVar99 = *(float *)(lVar13 + -0x20 + lVar74);
              fVar6 = *(float *)(lVar13 + -0x1c + lVar74);
              fVar129 = *(float *)(lVar13 + -0x18 + lVar74);
              fVar100 = *(float *)(lVar13 + -0x10 + lVar74);
              fVar121 = fVar99 * fVar94 + fVar6 * fVar98 + fVar129 * fVar106;
              fVar123 = fVar99 * fVar95 + fVar6 * fVar102 + fVar129 * fVar137;
              fVar108 = *(float *)(lVar13 + -0xc + lVar74);
              fVar92 = *(float *)(lVar13 + -8 + lVar74);
              fVar105 = fVar100 * fVar138 + fVar108 * fVar96 + fVar92 * fVar103;
              fVar107 = fVar100 * fVar93 + fVar108 * fVar97 + fVar92 * fVar136;
              fVar109 = fVar100 * fVar94 + fVar108 * fVar98 + fVar92 * fVar106;
              fVar111 = *(float *)(lVar13 + lVar74);
              fVar130 = *(float *)(lVar13 + 4 + lVar74);
              fVar135 = *(float *)(lVar13 + 8 + lVar74);
              fVar100 = fVar100 * fVar95 + fVar108 * fVar102 + fVar92 * fVar137;
              fVar79 = fVar113 * fVar95 + fVar128 * fVar102 + fVar79 * fVar137;
              fVar128 = fVar111 * fVar138 + fVar130 * fVar96 + fVar135 * fVar103 +
                        (pAVar61->p).field_0.m128[0];
              fVar108 = fVar111 * fVar93 + fVar130 * fVar97 + fVar135 * fVar136 +
                        (pAVar61->p).field_0.m128[1];
              fVar92 = fVar111 * fVar94 + fVar130 * fVar98 + fVar135 * fVar106 +
                       (pAVar61->p).field_0.m128[2];
              fVar111 = fVar111 * fVar95 + fVar130 * fVar102 + fVar135 * fVar137 +
                        (pAVar61->p).field_0.m128[3];
              fVar113 = fVar99 * fVar138 + fVar6 * fVar96 + fVar129 * fVar103;
              fVar99 = fVar99 * fVar93 + fVar6 * fVar97 + fVar129 * fVar136;
            }
            else if ((bVar10 == false) || (bVar11 == 0)) {
              if ((bVar10 == false) || (bVar11 != 0)) {
                if ((local_188 != 0.0) ||
                   ((((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))) ||
                    (uVar7 = *(undefined8 *)&(pAVar61->l).vz.field_0,
                    auVar20._4_4_ = -(uint)((pAVar61->l).vy.field_0.m128[0] != 0.0),
                    auVar20._0_4_ = -(uint)((pAVar61->l).vy.field_0.m128[2] != 0.0),
                    auVar20._8_4_ = -(uint)((float)uVar7 != 0.0),
                    auVar20._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                    uVar59 = movmskps((int)CONCAT71((int7)((ulong)plVar60 >> 8),bVar11),auVar20),
                    (char)uVar59 != '\0')))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                             ,0x83);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                  std::ostream::put(-0x20);
                  std::ostream::flush();
                  uVar71 = extraout_RDX_03;
                }
                pfVar2 = (float *)(lVar13 + -0x30 + lVar74);
                fVar79 = pfVar2[3];
                pfVar3 = (float *)(lVar13 + -0x20 + lVar74);
                fVar113 = *pfVar3;
                fVar123 = pfVar3[3];
                pfVar5 = (float *)(lVar13 + -0x10 + lVar74);
                fVar105 = *pfVar5;
                fVar107 = pfVar5[1];
                fVar100 = pfVar5[3];
                pfVar1 = (float *)(lVar13 + lVar74);
                fVar128 = *pfVar1;
                fVar108 = pfVar1[1];
                fVar92 = pfVar1[2];
                fVar111 = pfVar1[3];
                uVar7 = *(undefined8 *)&(pAVar61->p).field_0;
                fVar101 = (pAVar61->l).vx.field_0.m128[0] * *pfVar2;
                local_188 = pfVar2[1] + (float)uVar7;
                fVar104 = pfVar2[2] + (float)((ulong)uVar7 >> 0x20);
                fVar121 = pfVar3[2] + (pAVar61->p).field_0.m128[2];
                fVar99 = pfVar3[1] * (pAVar61->l).vy.field_0.m128[1];
                fVar109 = pfVar5[2] * (pAVar61->l).vz.field_0.m128[2];
                local_168.quaternion = true;
              }
              else {
                local_a8 = ZEXT416((uint)(pAVar61->p).field_0.m128[3]);
                local_108 = ZEXT416((uint)(pAVar61->l).vx.field_0.m128[3]);
                local_b8 = ZEXT416((uint)(pAVar61->l).vz.field_0.m128[3]);
                local_c8 = (pAVar61->l).vy.field_0.m128[0];
                fStack_c4 = (pAVar61->l).vy.field_0.m128[1];
                fStack_bc = (pAVar61->l).vy.field_0.m128[3];
                local_d8 = (pAVar61->l).vz.field_0.m128[0];
                fStack_d4 = (pAVar61->l).vz.field_0.m128[1];
                fStack_d0 = (pAVar61->l).vz.field_0.m128[2];
                fStack_cc = (pAVar61->l).vz.field_0.m128[3];
                local_98 = *(undefined8 *)((long)&(pAVar61->l).vy.field_0 + 8);
                uStack_90 = 0;
                fVar79 = (pAVar61->l).vx.field_0.m128[0];
                fStack_10c = (pAVar61->l).vx.field_0.m128[1];
                pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                fVar113 = *pfVar1;
                fVar128 = pfVar1[1];
                fVar123 = pfVar1[2];
                pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
                fVar105 = *pfVar1;
                fVar107 = pfVar1[1];
                fVar100 = pfVar1[2];
                puVar4 = (undefined8 *)(lVar13 + -0x10 + lVar74);
                local_e8 = *puVar4;
                uStack_e0 = puVar4[1];
                pfVar1 = (float *)(lVar13 + lVar74);
                fVar108 = *pfVar1;
                fVar92 = pfVar1[1];
                fVar111 = pfVar1[2];
                fVar101 = fVar113 * fVar79 + fVar128 * local_c8 + fVar123 * local_d8;
                fVar99 = fVar113 * 0.0 + fVar128 * fStack_c4 + fVar123 * fStack_d4;
                fVar113 = fVar113 * 0.0 + fVar128 * 0.0 + fVar123 * fStack_d0;
                fStack_130 = fVar105 * 0.0 + fVar107 * 0.0 + fVar100 * fStack_d0;
                fStack_12c = fVar105 * fStack_10c + fVar107 * fStack_bc + fVar100 * fStack_cc;
                local_138 = (SubdivMeshNode *)
                            CONCAT44(fVar105 * 0.0 + fVar107 * fStack_c4 + fVar100 * fStack_d4,
                                     fVar105 * fVar79 + fVar107 * local_c8 + fVar100 * local_d8);
                fStack_c0 = 0.0;
                local_118 = (HairSetNode *)(ulong)(uint)fVar79;
                fStack_110 = 0.0;
                fStack_f0 = fVar108 * 0.0 + fVar92 * 0.0 + fVar111 * fStack_d0 +
                            (pAVar61->p).field_0.m128[2];
                fStack_ec = fVar108 * fStack_10c + fVar92 * fStack_bc + fVar111 * fStack_cc +
                            (pAVar61->p).field_0.m128[3];
                local_f8.upper =
                     fVar108 * 0.0 + fVar92 * fStack_c4 + fVar111 * fStack_d4 +
                     (pAVar61->p).field_0.m128[1];
                local_f8.lower =
                     fVar108 * fVar79 + fVar92 * local_c8 + fVar111 * local_d8 +
                     (pAVar61->p).field_0.m128[0];
                if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                    ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_130 != 0.0)))))) ||
                   (NAN(fStack_130))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                             ,0x61);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                  std::ostream::put(-0x20);
                  std::ostream::flush();
                  uVar71 = extraout_RDX_02;
                }
                fVar105 = (float)local_118 * (float)local_e8 +
                          local_c8 * local_e8._4_4_ + local_d8 * (float)uStack_e0;
                fVar107 = local_118._4_4_ * (float)local_e8 +
                          fStack_c4 * local_e8._4_4_ + fStack_d4 * (float)uStack_e0;
                fVar109 = fStack_110 * (float)local_e8 +
                          fStack_c0 * local_e8._4_4_ + fStack_d0 * (float)uStack_e0;
                local_168.quaternion = true;
                fVar121 = (float)local_98;
                fVar123 = (float)((ulong)local_98 >> 0x20);
                fVar100 = (float)local_b8._0_4_;
                fVar79 = (float)local_108._0_4_;
                fVar128 = local_f8.lower;
                fVar108 = local_f8.upper;
                fVar92 = fStack_f0;
                fVar111 = (float)local_a8._0_4_;
                fVar113 = (float)local_138;
                fVar99 = local_138._4_4_;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                         ,0x67);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
              std::ostream::put(-0x20);
              std::ostream::flush();
              fVar79 = (pAVar61->p).field_0.m128[3];
              fVar104 = (pAVar61->l).vx.field_0.m128[3];
              fVar113 = (pAVar61->l).vy.field_0.m128[3];
              fVar128 = (pAVar61->l).vz.field_0.m128[3];
              aVar8 = (pAVar61->l).vx.field_0.field_1;
              fVar123 = (pAVar61->l).vy.field_0.m128[0];
              fVar105 = (pAVar61->l).vy.field_0.m128[1];
              fVar107 = (pAVar61->l).vz.field_0.m128[0];
              fVar100 = (pAVar61->l).vz.field_0.m128[1];
              fVar108 = (pAVar61->l).vz.field_0.m128[2];
              fVar130 = fVar104 * fVar113 + fVar79 * fVar128;
              fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
              fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                        -fVar128 * fVar128;
              fVar109 = fVar79 * fVar79 - fVar104 * fVar104;
              fVar129 = fVar113 * fVar113 + fVar109 + -fVar128 * fVar128;
              fVar138 = fVar104 * fVar128 - fVar79 * fVar113;
              fVar92 = fVar79 * fVar113 + fVar104 * fVar128;
              fVar135 = fVar113 * fVar128 + fVar79 * fVar104;
              fVar79 = fVar113 * fVar128 - fVar79 * fVar104;
              fVar111 = (pAVar61->p).field_0.m128[0];
              fVar99 = (pAVar61->p).field_0.m128[1];
              fVar6 = (pAVar61->p).field_0.m128[2];
              fVar130 = fVar130 + fVar130;
              fVar138 = fVar138 + fVar138;
              fVar101 = fVar101 + fVar101;
              fVar135 = fVar135 + fVar135;
              fVar92 = fVar92 + fVar92;
              fVar79 = fVar79 + fVar79;
              fVar104 = fVar128 * fVar128 + fVar109 + -fVar113 * fVar113;
              fVar117 = fVar121 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
              fVar119 = fVar121 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
              fVar122 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
              fVar124 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
              fVar112 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
              fVar114 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
              fVar115 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
              fVar116 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
              fVar135 = fVar92 * 1.0 + fVar79 * 0.0 + fVar104 * 0.0;
              fVar93 = fVar92 * 0.0 + fVar79 * 1.0 + fVar104 * 0.0;
              fVar95 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 1.0;
              fVar97 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 0.0;
              local_178 = aVar8.y;
              fStack_174 = aVar8.z;
              local_188 = aVar8.x;
              fVar131 = local_188 * fVar117 + fVar112 * 0.0 + fVar135 * 0.0;
              fVar132 = local_188 * fVar119 + fVar114 * 0.0 + fVar93 * 0.0;
              fVar133 = local_188 * fVar122 + fVar115 * 0.0 + fVar95 * 0.0;
              fVar134 = local_188 * fVar124 + fVar116 * 0.0 + fVar97 * 0.0;
              fVar138 = fVar123 * fVar117 + fVar105 * fVar112 + fVar135 * 0.0;
              fVar94 = fVar123 * fVar119 + fVar105 * fVar114 + fVar93 * 0.0;
              fVar96 = fVar123 * fVar122 + fVar105 * fVar115 + fVar95 * 0.0;
              fVar98 = fVar123 * fVar124 + fVar105 * fVar116 + fVar97 * 0.0;
              fVar129 = fVar107 * fVar117 + fVar100 * fVar112 + fVar108 * fVar135;
              fVar130 = fVar107 * fVar119 + fVar100 * fVar114 + fVar108 * fVar93;
              fStack_130 = fVar107 * fVar122 + fVar100 * fVar115 + fVar108 * fVar95;
              fStack_12c = fVar107 * fVar124 + fVar100 * fVar116 + fVar108 * fVar97;
              local_138 = (SubdivMeshNode *)CONCAT44(fVar130,fVar129);
              fVar79 = *(float *)(lVar13 + 0xc + lVar74);
              fVar104 = *(float *)(lVar13 + -0x24 + lVar74);
              fVar113 = *(float *)(lVar13 + -0x14 + lVar74);
              fVar128 = *(float *)(lVar13 + -4 + lVar74);
              fVar109 = fVar104 * fVar113 + fVar79 * fVar128;
              fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
              fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                        -fVar128 * fVar128;
              fVar105 = fVar79 * fVar79 - fVar104 * fVar104;
              fVar137 = fVar113 * fVar113 + fVar105 + -fVar128 * fVar128;
              fVar136 = fVar104 * fVar128 - fVar79 * fVar113;
              fVar106 = fVar79 * fVar113 + fVar104 * fVar128;
              fVar139 = fVar113 * fVar128 + fVar79 * fVar104;
              fVar92 = fVar113 * fVar128 - fVar79 * fVar104;
              pfVar2 = (float *)(lVar13 + -0x30 + lVar74);
              fVar79 = *pfVar2;
              pfVar3 = (float *)(lVar13 + -0x20 + lVar74);
              fVar104 = *pfVar3;
              fVar123 = pfVar3[1];
              fVar125 = fVar128 * fVar128 + fVar105 + -fVar113 * fVar113;
              pfVar1 = (float *)(lVar13 + -0x10 + lVar74);
              fVar113 = *pfVar1;
              fVar128 = pfVar1[1];
              fVar105 = pfVar1[2];
              fVar109 = fVar109 + fVar109;
              fVar136 = fVar136 + fVar136;
              pfVar1 = (float *)(lVar13 + lVar74);
              fVar107 = *pfVar1;
              fVar100 = pfVar1[1];
              fVar108 = pfVar1[2];
              fVar102 = fVar121 * 1.0 + fVar109 * 0.0 + fVar136 * 0.0;
              fVar103 = fVar121 * 0.0 + fVar109 * 1.0 + fVar136 * 0.0;
              fVar136 = fVar121 * 0.0 + fVar109 * 0.0 + fVar136 * 1.0;
              fVar101 = fVar101 + fVar101;
              fVar139 = fVar139 + fVar139;
              fVar106 = fVar106 + fVar106;
              fVar92 = fVar92 + fVar92;
              fVar121 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
              fVar109 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
              fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
              fVar137 = fVar106 * 1.0 + fVar92 * 0.0 + fVar125 * 0.0;
              fVar139 = fVar106 * 0.0 + fVar92 * 1.0 + fVar125 * 0.0;
              fVar92 = fVar106 * 0.0 + fVar92 * 0.0 + fVar125 * 1.0;
              fVar118 = fVar79 * fVar102 + fVar121 * 0.0 + fVar137 * 0.0;
              fVar120 = fVar79 * fVar103 + fVar109 * 0.0 + fVar139 * 0.0;
              fVar79 = fVar79 * fVar136 + fVar101 * 0.0 + fVar92 * 0.0;
              fVar106 = fVar104 * fVar102 + fVar123 * fVar121 + fVar137 * 0.0;
              fVar125 = fVar104 * fVar103 + fVar123 * fVar109 + fVar139 * 0.0;
              fVar110 = fVar104 * fVar136 + fVar123 * fVar101 + fVar92 * 0.0;
              fVar126 = fVar113 * fVar102 + fVar128 * fVar121 + fVar105 * fVar137;
              fVar127 = fVar113 * fVar103 + fVar128 * fVar109 + fVar105 * fVar139;
              fVar128 = fVar113 * fVar136 + fVar128 * fVar101 + fVar105 * fVar92;
              fVar113 = fVar107 * fVar102 + fVar100 * fVar121 + fVar108 * fVar137 + pfVar2[1] + 0.0;
              fVar102 = fVar107 * fVar103 + fVar100 * fVar109 + fVar108 * fVar139 + pfVar2[2] + 0.0;
              fVar103 = fVar107 * fVar136 + fVar100 * fVar101 + fVar108 * fVar92 + pfVar3[2] + 0.0;
              fVar101 = fVar118 * fVar131 + fVar120 * fVar138 + fVar79 * fVar129;
              local_188 = fVar118 * fVar132 + fVar120 * fVar94 + fVar79 * fVar130;
              fVar104 = fVar118 * fVar133 + fVar120 * fVar96 + fVar79 * fStack_130;
              fVar121 = fVar106 * fVar133 + fVar125 * fVar96 + fVar110 * fStack_130;
              fVar123 = fVar106 * fVar134 + fVar125 * fVar98 + fVar110 * fStack_12c;
              fVar105 = fVar126 * fVar131 + fVar127 * fVar138 + fVar128 * fVar129;
              fVar107 = fVar126 * fVar132 + fVar127 * fVar94 + fVar128 * fVar130;
              fVar109 = fVar126 * fVar133 + fVar127 * fVar96 + fVar128 * fStack_130;
              uVar71 = extraout_RDX_01;
              fVar100 = fVar126 * fVar134 + fVar127 * fVar98 + fVar128 * fStack_12c;
              fVar79 = fVar118 * fVar134 + fVar120 * fVar98 + fVar79 * fStack_12c;
              fVar128 = fVar113 * fVar131 + fVar102 * fVar138 + fVar103 * fVar129 +
                        fVar111 * fVar117 + fVar99 * fVar112 + fVar6 * fVar135 + local_178 + 0.0;
              fVar108 = fVar113 * fVar132 + fVar102 * fVar94 + fVar103 * fVar130 +
                        fVar111 * fVar119 + fVar99 * fVar114 + fVar6 * fVar93 + fStack_174 + 0.0;
              fVar92 = fVar113 * fVar133 + fVar102 * fVar96 + fVar103 * fStack_130 +
                       fVar111 * fVar122 + fVar99 * fVar115 + fVar6 * fVar95 +
                       (pAVar61->l).vy.field_0.m128[2] + 0.0;
              fVar111 = fVar113 * fVar134 + fVar102 * fVar98 + fVar103 * fStack_12c +
                        fVar111 * fVar124 + fVar99 * fVar116 + fVar6 * fVar97 + 0.0;
              fVar113 = fVar106 * fVar131 + fVar125 * fVar138 + fVar110 * fVar129;
              fVar99 = fVar106 * fVar132 + fVar125 * fVar94 + fVar110 * fVar130;
            }
          }
          else {
            auVar17._4_4_ = -(uint)((pAVar61->l).vy.field_0.m128[0] != 0.0);
            auVar17._0_4_ = -(uint)((pAVar61->l).vx.field_0.m128[3] != 0.0);
            auVar17._8_4_ = -(uint)((pAVar61->l).vy.field_0.m128[1] != 1.0);
            auVar17._12_4_ = -(uint)((pAVar61->l).vy.field_0.m128[2] != 0.0);
            uVar75 = movmskps(uVar75,auVar17);
            if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar69 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69),
                bVar69 != 0)))) goto LAB_00160e04;
            auVar18._4_4_ = -(uint)((pAVar61->l).vz.field_0.m128[0] != 0.0);
            auVar18._0_4_ = -(uint)((pAVar61->l).vy.field_0.m128[3] != 0.0);
            auVar18._8_4_ = -(uint)((pAVar61->l).vz.field_0.m128[1] != 0.0);
            auVar18._12_4_ = -(uint)((pAVar61->l).vz.field_0.m128[2] != 1.0);
            uVar75 = movmskps(uVar75,auVar18);
            if (((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar69 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69),
               bVar69 != 0)) goto LAB_00160e04;
            auVar19._4_4_ = -(uint)((pAVar61->p).field_0.m128[0] != 0.0);
            auVar19._0_4_ = -(uint)((pAVar61->l).vz.field_0.m128[3] != 0.0);
            auVar19._8_4_ = -(uint)((pAVar61->p).field_0.m128[1] != 0.0);
            auVar19._12_4_ = -(uint)((pAVar61->p).field_0.m128[2] != 0.0);
            uVar75 = movmskps(uVar75,auVar19);
            if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_00160e04;
            bVar69 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
            uVar71 = (ulong)uVar75;
            if ((bVar69 != 0) ||
               ((bVar10 != false &&
                ((fVar79 = (pAVar61->p).field_0.m128[3], fVar79 != 1.0 || (NAN(fVar79)))))))
            goto LAB_00160e04;
            pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
            fVar101 = *pfVar1;
            local_188 = pfVar1[1];
            fVar104 = pfVar1[2];
            fVar79 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
            fVar113 = *pfVar1;
            fVar99 = pfVar1[1];
            fVar121 = pfVar1[2];
            fVar123 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x10 + lVar74);
            fVar105 = *pfVar1;
            fVar107 = pfVar1[1];
            fVar109 = pfVar1[2];
            fVar100 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + lVar74);
            fVar128 = *pfVar1;
            fVar108 = pfVar1[1];
            fVar92 = pfVar1[2];
            fVar111 = pfVar1[3];
            local_168.quaternion = (bool)bVar11;
          }
LAB_001618c8:
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x30);
          *pfVar1 = fVar101;
          pfVar1[1] = local_188;
          pfVar1[2] = fVar104;
          pfVar1[3] = fVar79;
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x20);
          *pfVar1 = fVar113;
          pfVar1[1] = fVar99;
          pfVar1[2] = fVar121;
          pfVar1[3] = fVar123;
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x10);
          *pfVar1 = fVar105;
          pfVar1[1] = fVar107;
          pfVar1[2] = fVar109;
          pfVar1[3] = fVar100;
          pfVar1 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar74);
          *pfVar1 = fVar128;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar92;
          pfVar1[3] = fVar111;
          uVar72 = uVar72 + 1;
          lVar74 = lVar74 + 0x40;
          plVar60 = local_88;
        } while (uVar72 < (ulong)local_88[0xf]);
      }
    }
    else if (plVar60[0xf] == 1) {
      fVar79 = (spaces->time_range).lower;
      fVar104 = (spaces->time_range).upper;
      fVar113 = (float)plVar60[0xd];
      fVar128 = (float)((ulong)plVar60[0xd] >> 0x20);
      uVar75 = -(uint)(fVar79 < fVar113);
      uVar77 = -(uint)(fVar104 < fVar128);
      local_168.time_range.upper = (float)(~uVar77 & (uint)fVar128 | (uint)fVar104 & uVar77);
      local_168.time_range.lower = (float)(~uVar75 & (uint)fVar79 | (uint)fVar113 & uVar75);
      local_168.spaces.size_active = 0;
      local_168.spaces.size_alloced = 0;
      local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      uVar71 = extraout_RDX;
      if (sVar12 != 0) {
        local_168.spaces.items =
             (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar12 << 6,0x10);
        uVar71 = extraout_RDX_04;
        local_168.spaces.size_alloced = sVar12;
      }
      local_168.quaternion = true;
      if (spaces->quaternion == false) {
        local_168.quaternion = SUB41((int)plVar60[0x12],0);
      }
      local_168.spaces.size_active = local_168.spaces.size_alloced;
      if ((spaces->spaces).size_active != 0) {
        lVar74 = 0x30;
        uVar72 = 0;
        do {
          uVar75 = (uint)uVar71;
          pAVar61 = (spaces->spaces).items;
          pfVar1 = (float *)plVar60[0x11];
          bVar10 = spaces->quaternion;
          bVar11 = *(byte *)(plVar60 + 0x12);
          local_168.quaternion = false;
          fVar79 = *(float *)((long)pAVar61 + lVar74 + -0x30);
          uVar7 = *(undefined8 *)((long)pAVar61 + lVar74 + -0x2c);
          fVar104 = (float)((ulong)uVar7 >> 0x20);
          local_188 = (float)uVar7;
          if ((((fVar79 != 1.0) || (NAN(fVar79))) || (local_188 != 0.0)) ||
             (((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))))) {
LAB_00161b13:
            fVar113 = (float)*(undefined8 *)pfVar1;
            fVar128 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
            iVar76 = -(uint)(fVar113 != 1.0);
            iVar78 = -(uint)(fVar128 != 0.0);
            auVar83._4_4_ = iVar78;
            auVar83._0_4_ = iVar76;
            auVar83._8_4_ = iVar78;
            auVar83._12_4_ = iVar78;
            auVar82._8_8_ = auVar83._8_8_;
            auVar82._4_4_ = iVar76;
            auVar82._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar82);
            uVar71 = (ulong)uVar75;
            fVar79 = pfVar1[2];
            if ((uVar75 & 1) == 0) {
              bVar69 = (byte)uVar75 >> 1;
              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
              uVar71 = (ulong)uVar75;
              if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                auVar43._4_4_ = -(uint)(pfVar1[4] != 0.0);
                auVar43._0_4_ = -(uint)(pfVar1[3] != 0.0);
                auVar43._8_4_ = -(uint)(pfVar1[5] != 1.0);
                auVar43._12_4_ = -(uint)(pfVar1[6] != 0.0);
                uVar75 = movmskps(uVar75,auVar43);
                uVar71 = (ulong)uVar75;
                if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) && ((uVar75 & 4) == 0))
                {
                  bVar69 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                  uVar71 = (ulong)uVar75;
                  if (bVar69 == 0) {
                    auVar44._4_4_ = -(uint)(pfVar1[8] != 0.0);
                    auVar44._0_4_ = -(uint)(pfVar1[7] != 0.0);
                    auVar44._8_4_ = -(uint)(pfVar1[9] != 0.0);
                    auVar44._12_4_ = -(uint)(pfVar1[10] != 1.0);
                    uVar75 = movmskps(uVar75,auVar44);
                    uVar71 = (ulong)uVar75;
                    if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) {
                      bVar69 = ((byte)uVar75 & 8) >> 3;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      uVar71 = (ulong)uVar75;
                      if (bVar69 == 0) {
                        auVar45._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                        auVar45._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                        auVar45._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                        auVar45._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                        uVar75 = movmskps(uVar75,auVar45);
                        uVar71 = (ulong)uVar75;
                        if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar75 & 8) >> 3,
                            uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar11 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                          pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x30);
                          fVar101 = *pfVar1;
                          local_188 = pfVar1[1];
                          fVar104 = pfVar1[2];
                          fVar79 = pfVar1[3];
                          pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x20);
                          fVar113 = *pfVar1;
                          fVar99 = pfVar1[1];
                          fVar121 = pfVar1[2];
                          fVar123 = pfVar1[3];
                          pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x10);
                          fVar105 = *pfVar1;
                          fVar107 = pfVar1[1];
                          fVar109 = pfVar1[2];
                          fVar100 = pfVar1[3];
                          pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
                          fVar128 = *pfVar1;
                          fVar108 = pfVar1[1];
                          fVar92 = pfVar1[2];
                          fVar111 = pfVar1[3];
                          local_168.quaternion = bVar10;
                          goto LAB_00162599;
                        }
                      }
                    }
                  }
                }
              }
            }
            if ((bVar10 == false) && (bVar11 == 0)) {
              pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x30);
              fVar138 = *pfVar2;
              fVar93 = pfVar2[1];
              fVar94 = pfVar2[2];
              fVar95 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x20);
              fVar96 = *pfVar2;
              fVar97 = pfVar2[1];
              fVar98 = pfVar2[2];
              fVar102 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x10);
              fVar103 = *pfVar2;
              fVar136 = pfVar2[1];
              fVar106 = pfVar2[2];
              fVar137 = pfVar2[3];
              fVar101 = fVar113 * fVar138 + fVar128 * fVar96 + fVar79 * fVar103;
              local_188 = fVar113 * fVar93 + fVar128 * fVar97 + fVar79 * fVar136;
              fVar104 = fVar113 * fVar94 + fVar128 * fVar98 + fVar79 * fVar106;
              fVar99 = pfVar1[4];
              fVar6 = pfVar1[5];
              fVar129 = pfVar1[6];
              fVar100 = pfVar1[8];
              fVar121 = fVar99 * fVar94 + fVar6 * fVar98 + fVar129 * fVar106;
              fVar123 = fVar99 * fVar95 + fVar6 * fVar102 + fVar129 * fVar137;
              fVar108 = pfVar1[9];
              fVar92 = pfVar1[10];
              fVar105 = fVar100 * fVar138 + fVar108 * fVar96 + fVar92 * fVar103;
              fVar107 = fVar100 * fVar93 + fVar108 * fVar97 + fVar92 * fVar136;
              fVar109 = fVar100 * fVar94 + fVar108 * fVar98 + fVar92 * fVar106;
              fVar111 = pfVar1[0xc];
              fVar130 = pfVar1[0xd];
              fVar135 = pfVar1[0xe];
              pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
              fVar100 = fVar100 * fVar95 + fVar108 * fVar102 + fVar92 * fVar137;
              fVar79 = fVar113 * fVar95 + fVar128 * fVar102 + fVar79 * fVar137;
              fVar128 = fVar111 * fVar138 + fVar130 * fVar96 + fVar135 * fVar103 + *pfVar1;
              fVar108 = fVar111 * fVar93 + fVar130 * fVar97 + fVar135 * fVar136 + pfVar1[1];
              fVar92 = fVar111 * fVar94 + fVar130 * fVar98 + fVar135 * fVar106 + pfVar1[2];
              fVar111 = fVar111 * fVar95 + fVar130 * fVar102 + fVar135 * fVar137 + pfVar1[3];
              fVar113 = fVar99 * fVar138 + fVar6 * fVar96 + fVar129 * fVar103;
              fVar99 = fVar99 * fVar93 + fVar6 * fVar97 + fVar129 * fVar136;
            }
            else if ((bVar10 == false) || (bVar11 == 0)) {
              if ((bVar10 == false) || (bVar11 != 0)) {
                if ((local_188 != 0.0) ||
                   ((((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))) ||
                    (uVar7 = *(undefined8 *)((long)pAVar61 + lVar74 + -0x10),
                    auVar24._4_4_ = -(uint)(*(float *)((long)pAVar61 + lVar74 + -0x20) != 0.0),
                    auVar24._0_4_ = -(uint)(*(float *)((long)pAVar61 + lVar74 + -0x18) != 0.0),
                    auVar24._8_4_ = -(uint)((float)uVar7 != 0.0),
                    auVar24._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                    uVar59 = movmskps((int)CONCAT71((int7)((ulong)plVar60 >> 8),bVar11),auVar24),
                    (char)uVar59 != '\0')))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                             ,0x83);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                  std::ostream::put(-0x20);
                  std::ostream::flush();
                  uVar71 = extraout_RDX_07;
                }
                fVar79 = pfVar1[3];
                fVar113 = pfVar1[4];
                fVar123 = pfVar1[7];
                fVar105 = pfVar1[8];
                fVar107 = pfVar1[9];
                fVar100 = pfVar1[0xb];
                fVar128 = pfVar1[0xc];
                fVar108 = pfVar1[0xd];
                fVar92 = pfVar1[0xe];
                fVar111 = pfVar1[0xf];
                uVar7 = *(undefined8 *)((long)&(pAVar61->l).vx.field_0 + lVar74);
                fVar101 = *(float *)((long)pAVar61 + lVar74 + -0x30) * *pfVar1;
                local_188 = pfVar1[1] + (float)uVar7;
                fVar104 = pfVar1[2] + (float)((ulong)uVar7 >> 0x20);
                fVar121 = pfVar1[6] + *(float *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 8);
                fVar99 = pfVar1[5] * *(float *)((long)pAVar61 + lVar74 + -0x1c);
                fVar109 = pfVar1[10] * *(float *)((long)pAVar61 + lVar74 + -8);
                local_168.quaternion = true;
              }
              else {
                local_a8 = ZEXT416(*(uint *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 0xc));
                local_108 = ZEXT416(*(uint *)((long)pAVar61 + lVar74 + -0x24));
                local_b8 = ZEXT416(*(uint *)((long)pAVar61 + lVar74 + -4));
                pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x20);
                local_c8 = *pfVar2;
                fStack_c4 = pfVar2[1];
                fStack_bc = pfVar2[3];
                pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x10);
                local_d8 = *pfVar2;
                fStack_d4 = pfVar2[1];
                fStack_d0 = pfVar2[2];
                fStack_cc = pfVar2[3];
                local_98 = *(undefined8 *)((long)pAVar61 + lVar74 + -0x18);
                uStack_90 = 0;
                pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x30);
                fVar79 = *pfVar2;
                fStack_10c = pfVar2[1];
                fVar113 = *pfVar1;
                fVar128 = pfVar1[1];
                fVar123 = pfVar1[2];
                fVar105 = pfVar1[4];
                fVar107 = pfVar1[5];
                fVar100 = pfVar1[6];
                local_e8 = *(undefined8 *)(pfVar1 + 8);
                uStack_e0 = *(undefined8 *)(pfVar1 + 10);
                fVar108 = pfVar1[0xc];
                fVar92 = pfVar1[0xd];
                fVar111 = pfVar1[0xe];
                fVar101 = fVar113 * fVar79 + fVar128 * local_c8 + fVar123 * local_d8;
                fVar99 = fVar113 * 0.0 + fVar128 * fStack_c4 + fVar123 * fStack_d4;
                fVar113 = fVar113 * 0.0 + fVar128 * 0.0 + fVar123 * fStack_d0;
                fStack_130 = fVar105 * 0.0 + fVar107 * 0.0 + fVar100 * fStack_d0;
                fStack_12c = fVar105 * fStack_10c + fVar107 * fStack_bc + fVar100 * fStack_cc;
                local_138 = (SubdivMeshNode *)
                            CONCAT44(fVar105 * 0.0 + fVar107 * fStack_c4 + fVar100 * fStack_d4,
                                     fVar105 * fVar79 + fVar107 * local_c8 + fVar100 * local_d8);
                fStack_c0 = 0.0;
                local_118 = (HairSetNode *)(ulong)(uint)fVar79;
                fStack_110 = 0.0;
                pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
                fStack_f0 = fVar108 * 0.0 + fVar92 * 0.0 + fVar111 * fStack_d0 + pfVar1[2];
                fStack_ec = fVar108 * fStack_10c + fVar92 * fStack_bc + fVar111 * fStack_cc +
                            pfVar1[3];
                local_f8.upper =
                     fVar108 * 0.0 + fVar92 * fStack_c4 + fVar111 * fStack_d4 + pfVar1[1];
                local_f8.lower = fVar108 * fVar79 + fVar92 * local_c8 + fVar111 * local_d8 + *pfVar1
                ;
                if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                    ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_130 != 0.0)))))) ||
                   (NAN(fStack_130))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                             ,0x61);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                  std::ostream::put(-0x20);
                  std::ostream::flush();
                  uVar71 = extraout_RDX_06;
                }
                fVar105 = (float)local_118 * (float)local_e8 +
                          local_c8 * local_e8._4_4_ + local_d8 * (float)uStack_e0;
                fVar107 = local_118._4_4_ * (float)local_e8 +
                          fStack_c4 * local_e8._4_4_ + fStack_d4 * (float)uStack_e0;
                fVar109 = fStack_110 * (float)local_e8 +
                          fStack_c0 * local_e8._4_4_ + fStack_d0 * (float)uStack_e0;
                local_168.quaternion = true;
                fVar121 = (float)local_98;
                fVar123 = (float)((ulong)local_98 >> 0x20);
                fVar100 = (float)local_b8._0_4_;
                fVar79 = (float)local_108._0_4_;
                fVar128 = local_f8.lower;
                fVar108 = local_f8.upper;
                fVar92 = fStack_f0;
                fVar111 = (float)local_a8._0_4_;
                fVar113 = (float)local_138;
                fVar99 = local_138._4_4_;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                         ,0x67);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
              std::ostream::put(-0x20);
              std::ostream::flush();
              fVar79 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 0xc);
              fVar104 = *(float *)((long)pAVar61 + lVar74 + -0x24);
              fVar113 = *(float *)((long)pAVar61 + lVar74 + -0x14);
              fVar128 = *(float *)((long)pAVar61 + lVar74 + -4);
              auVar9 = *(undefined1 (*) [16])((long)pAVar61 + lVar74 + -0x30);
              pfVar3 = (float *)((long)pAVar61 + lVar74 + -0x20);
              fVar123 = *pfVar3;
              fVar105 = pfVar3[1];
              pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x10);
              fVar107 = *pfVar2;
              fVar100 = pfVar2[1];
              fVar108 = pfVar2[2];
              fVar130 = fVar104 * fVar113 + fVar79 * fVar128;
              fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
              fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                        -fVar128 * fVar128;
              fVar109 = fVar79 * fVar79 - fVar104 * fVar104;
              fVar129 = fVar113 * fVar113 + fVar109 + -fVar128 * fVar128;
              fVar138 = fVar104 * fVar128 - fVar79 * fVar113;
              fVar92 = fVar79 * fVar113 + fVar104 * fVar128;
              fVar135 = fVar113 * fVar128 + fVar79 * fVar104;
              fVar79 = fVar113 * fVar128 - fVar79 * fVar104;
              pfVar2 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
              fVar111 = *pfVar2;
              fVar99 = pfVar2[1];
              fVar6 = pfVar2[2];
              fVar130 = fVar130 + fVar130;
              fVar138 = fVar138 + fVar138;
              fVar101 = fVar101 + fVar101;
              fVar135 = fVar135 + fVar135;
              fVar92 = fVar92 + fVar92;
              fVar79 = fVar79 + fVar79;
              fVar104 = fVar128 * fVar128 + fVar109 + -fVar113 * fVar113;
              fVar117 = fVar121 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
              fVar119 = fVar121 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
              fVar122 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
              fVar124 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
              fVar112 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
              fVar114 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
              fVar115 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
              fVar116 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
              fVar135 = fVar92 * 1.0 + fVar79 * 0.0 + fVar104 * 0.0;
              fVar93 = fVar92 * 0.0 + fVar79 * 1.0 + fVar104 * 0.0;
              fVar95 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 1.0;
              fVar97 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 0.0;
              local_178 = auVar9._4_4_;
              fStack_174 = auVar9._8_4_;
              local_188 = auVar9._0_4_;
              fVar131 = local_188 * fVar117 + fVar112 * 0.0 + fVar135 * 0.0;
              fVar132 = local_188 * fVar119 + fVar114 * 0.0 + fVar93 * 0.0;
              fVar133 = local_188 * fVar122 + fVar115 * 0.0 + fVar95 * 0.0;
              fVar134 = local_188 * fVar124 + fVar116 * 0.0 + fVar97 * 0.0;
              fVar138 = fVar123 * fVar117 + fVar105 * fVar112 + fVar135 * 0.0;
              fVar94 = fVar123 * fVar119 + fVar105 * fVar114 + fVar93 * 0.0;
              fVar96 = fVar123 * fVar122 + fVar105 * fVar115 + fVar95 * 0.0;
              fVar98 = fVar123 * fVar124 + fVar105 * fVar116 + fVar97 * 0.0;
              fVar129 = fVar107 * fVar117 + fVar100 * fVar112 + fVar108 * fVar135;
              fVar130 = fVar107 * fVar119 + fVar100 * fVar114 + fVar108 * fVar93;
              fStack_130 = fVar107 * fVar122 + fVar100 * fVar115 + fVar108 * fVar95;
              fStack_12c = fVar107 * fVar124 + fVar100 * fVar116 + fVar108 * fVar97;
              local_138 = (SubdivMeshNode *)CONCAT44(fVar130,fVar129);
              fVar79 = pfVar1[0xf];
              fVar104 = pfVar1[3];
              fVar113 = pfVar1[7];
              fVar128 = pfVar1[0xb];
              fVar109 = fVar104 * fVar113 + fVar79 * fVar128;
              fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
              fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                        -fVar128 * fVar128;
              fVar105 = fVar79 * fVar79 - fVar104 * fVar104;
              fVar137 = fVar113 * fVar113 + fVar105 + -fVar128 * fVar128;
              fVar136 = fVar104 * fVar128 - fVar79 * fVar113;
              fVar106 = fVar79 * fVar113 + fVar104 * fVar128;
              fVar139 = fVar113 * fVar128 + fVar79 * fVar104;
              fVar92 = fVar113 * fVar128 - fVar79 * fVar104;
              fVar79 = *pfVar1;
              fVar104 = pfVar1[4];
              fVar123 = pfVar1[5];
              fVar125 = fVar128 * fVar128 + fVar105 + -fVar113 * fVar113;
              fVar113 = pfVar1[8];
              fVar128 = pfVar1[9];
              fVar105 = pfVar1[10];
              fVar109 = fVar109 + fVar109;
              fVar136 = fVar136 + fVar136;
              fVar107 = pfVar1[0xc];
              fVar100 = pfVar1[0xd];
              fVar108 = pfVar1[0xe];
              fVar102 = fVar121 * 1.0 + fVar109 * 0.0 + fVar136 * 0.0;
              fVar103 = fVar121 * 0.0 + fVar109 * 1.0 + fVar136 * 0.0;
              fVar136 = fVar121 * 0.0 + fVar109 * 0.0 + fVar136 * 1.0;
              fVar101 = fVar101 + fVar101;
              fVar139 = fVar139 + fVar139;
              fVar106 = fVar106 + fVar106;
              fVar92 = fVar92 + fVar92;
              fVar121 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
              fVar109 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
              fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
              fVar137 = fVar106 * 1.0 + fVar92 * 0.0 + fVar125 * 0.0;
              fVar139 = fVar106 * 0.0 + fVar92 * 1.0 + fVar125 * 0.0;
              fVar92 = fVar106 * 0.0 + fVar92 * 0.0 + fVar125 * 1.0;
              fVar118 = fVar79 * fVar102 + fVar121 * 0.0 + fVar137 * 0.0;
              fVar120 = fVar79 * fVar103 + fVar109 * 0.0 + fVar139 * 0.0;
              fVar79 = fVar79 * fVar136 + fVar101 * 0.0 + fVar92 * 0.0;
              fVar106 = fVar104 * fVar102 + fVar123 * fVar121 + fVar137 * 0.0;
              fVar125 = fVar104 * fVar103 + fVar123 * fVar109 + fVar139 * 0.0;
              fVar110 = fVar104 * fVar136 + fVar123 * fVar101 + fVar92 * 0.0;
              fVar126 = fVar113 * fVar102 + fVar128 * fVar121 + fVar105 * fVar137;
              fVar127 = fVar113 * fVar103 + fVar128 * fVar109 + fVar105 * fVar139;
              fVar128 = fVar113 * fVar136 + fVar128 * fVar101 + fVar105 * fVar92;
              fVar113 = fVar107 * fVar102 + fVar100 * fVar121 + fVar108 * fVar137 + pfVar1[1] + 0.0;
              fVar102 = fVar107 * fVar103 + fVar100 * fVar109 + fVar108 * fVar139 + pfVar1[2] + 0.0;
              fVar103 = fVar107 * fVar136 + fVar100 * fVar101 + fVar108 * fVar92 + pfVar1[6] + 0.0;
              fVar101 = fVar118 * fVar131 + fVar120 * fVar138 + fVar79 * fVar129;
              local_188 = fVar118 * fVar132 + fVar120 * fVar94 + fVar79 * fVar130;
              fVar104 = fVar118 * fVar133 + fVar120 * fVar96 + fVar79 * fStack_130;
              fVar121 = fVar106 * fVar133 + fVar125 * fVar96 + fVar110 * fStack_130;
              fVar123 = fVar106 * fVar134 + fVar125 * fVar98 + fVar110 * fStack_12c;
              fVar105 = fVar126 * fVar131 + fVar127 * fVar138 + fVar128 * fVar129;
              fVar107 = fVar126 * fVar132 + fVar127 * fVar94 + fVar128 * fVar130;
              fVar109 = fVar126 * fVar133 + fVar127 * fVar96 + fVar128 * fStack_130;
              uVar71 = extraout_RDX_05;
              fVar100 = fVar126 * fVar134 + fVar127 * fVar98 + fVar128 * fStack_12c;
              fVar79 = fVar118 * fVar134 + fVar120 * fVar98 + fVar79 * fStack_12c;
              fVar128 = fVar113 * fVar131 + fVar102 * fVar138 + fVar103 * fVar129 +
                        fVar111 * fVar117 + fVar99 * fVar112 + fVar6 * fVar135 + local_178 + 0.0;
              fVar108 = fVar113 * fVar132 + fVar102 * fVar94 + fVar103 * fVar130 +
                        fVar111 * fVar119 + fVar99 * fVar114 + fVar6 * fVar93 + fStack_174 + 0.0;
              fVar92 = fVar113 * fVar133 + fVar102 * fVar96 + fVar103 * fStack_130 +
                       fVar111 * fVar122 + fVar99 * fVar115 + fVar6 * fVar95 + pfVar3[2] + 0.0;
              fVar111 = fVar113 * fVar134 + fVar102 * fVar98 + fVar103 * fStack_12c +
                        fVar111 * fVar124 + fVar99 * fVar116 + fVar6 * fVar97 + 0.0;
              fVar113 = fVar106 * fVar131 + fVar125 * fVar138 + fVar110 * fVar129;
              fVar99 = fVar106 * fVar132 + fVar125 * fVar94 + fVar110 * fVar130;
            }
          }
          else {
            pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x24);
            auVar21._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar21._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar21._8_4_ = -(uint)(pfVar2[2] != 1.0);
            auVar21._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar21);
            if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar69 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69),
                bVar69 != 0)))) goto LAB_00161b13;
            pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x14);
            auVar22._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar22._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar22._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar22._12_4_ = -(uint)(pfVar2[3] != 1.0);
            uVar75 = movmskps(uVar75,auVar22);
            if (((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar69 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69),
               bVar69 != 0)) goto LAB_00161b13;
            pfVar2 = (float *)((long)pAVar61 + lVar74 + -4);
            auVar23._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar23._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar23._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar23._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar23);
            if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_00161b13;
            bVar69 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
            uVar71 = (ulong)uVar75;
            if ((bVar69 != 0) ||
               ((bVar10 != false &&
                ((fVar79 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 0xc), fVar79 != 1.0
                 || (NAN(fVar79))))))) goto LAB_00161b13;
            fVar101 = *pfVar1;
            local_188 = pfVar1[1];
            fVar104 = pfVar1[2];
            fVar79 = pfVar1[3];
            fVar113 = pfVar1[4];
            fVar99 = pfVar1[5];
            fVar121 = pfVar1[6];
            fVar123 = pfVar1[7];
            fVar105 = pfVar1[8];
            fVar107 = pfVar1[9];
            fVar109 = pfVar1[10];
            fVar100 = pfVar1[0xb];
            fVar128 = pfVar1[0xc];
            fVar108 = pfVar1[0xd];
            fVar92 = pfVar1[0xe];
            fVar111 = pfVar1[0xf];
            local_168.quaternion = (bool)bVar11;
          }
LAB_00162599:
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x30);
          *pfVar1 = fVar101;
          pfVar1[1] = local_188;
          pfVar1[2] = fVar104;
          pfVar1[3] = fVar79;
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x20);
          *pfVar1 = fVar113;
          pfVar1[1] = fVar99;
          pfVar1[2] = fVar121;
          pfVar1[3] = fVar123;
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x10);
          *pfVar1 = fVar105;
          pfVar1[1] = fVar107;
          pfVar1[2] = fVar109;
          pfVar1[3] = fVar100;
          pfVar1 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar74);
          *pfVar1 = fVar128;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar92;
          pfVar1[3] = fVar111;
          uVar72 = uVar72 + 1;
          lVar74 = lVar74 + 0x40;
          plVar60 = local_88;
        } while (uVar72 < (spaces->spaces).size_active);
      }
    }
    else {
      if (sVar12 != plVar60[0xf]) {
        prVar68 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar68,"number of transformations does not match");
        __cxa_throw(prVar68,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fVar79 = (spaces->time_range).lower;
      fVar104 = (spaces->time_range).upper;
      fVar113 = (float)plVar60[0xd];
      fVar128 = (float)((ulong)plVar60[0xd] >> 0x20);
      uVar75 = -(uint)(fVar79 < fVar113);
      uVar77 = -(uint)(fVar104 < fVar128);
      local_168.time_range.upper = (float)(~uVar77 & (uint)fVar128 | (uint)fVar104 & uVar77);
      local_168.time_range.lower = (float)(~uVar75 & (uint)fVar79 | (uint)fVar113 & uVar75);
      local_168.spaces.size_active = 0;
      local_168.spaces.size_alloced = 0;
      local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      uVar71 = extraout_RDX;
      if (sVar12 != 0) {
        local_168.spaces.items =
             (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar12 << 6,0x10);
        uVar71 = extraout_RDX_08;
        local_168.spaces.size_alloced = sVar12;
      }
      local_168.quaternion = true;
      if (spaces->quaternion == false) {
        local_168.quaternion = SUB41((int)plVar60[0x12],0);
      }
      local_168.spaces.size_active = local_168.spaces.size_alloced;
      if ((spaces->spaces).size_active != 0) {
        lVar74 = 0x30;
        uVar72 = 0;
        do {
          uVar75 = (uint)uVar71;
          pAVar61 = (spaces->spaces).items;
          lVar13 = plVar60[0x11];
          bVar10 = spaces->quaternion;
          bVar11 = *(byte *)(plVar60 + 0x12);
          local_168.quaternion = false;
          fVar79 = *(float *)((long)pAVar61 + lVar74 + -0x30);
          uVar7 = *(undefined8 *)((long)pAVar61 + lVar74 + -0x2c);
          fVar104 = (float)((ulong)uVar7 >> 0x20);
          local_188 = (float)uVar7;
          if (((((fVar79 != 1.0) || (NAN(fVar79))) || (local_188 != 0.0)) ||
              ((NAN(local_188) || (fVar104 != 0.0)))) || (NAN(fVar104))) {
LAB_001627b5:
            uVar7 = *(undefined8 *)(lVar13 + -0x30 + lVar74);
            fVar113 = (float)uVar7;
            fVar128 = (float)((ulong)uVar7 >> 0x20);
            iVar76 = -(uint)(fVar113 != 1.0);
            iVar78 = -(uint)(fVar128 != 0.0);
            auVar85._4_4_ = iVar78;
            auVar85._0_4_ = iVar76;
            auVar85._8_4_ = iVar78;
            auVar85._12_4_ = iVar78;
            auVar84._8_8_ = auVar85._8_8_;
            auVar84._4_4_ = iVar76;
            auVar84._0_4_ = iVar76;
            uVar75 = movmskpd(uVar75,auVar84);
            uVar71 = (ulong)uVar75;
            fVar79 = *(float *)(lVar13 + -0x28 + lVar74);
            if ((uVar75 & 1) == 0) {
              bVar69 = (byte)uVar75 >> 1;
              uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
              uVar71 = (ulong)uVar75;
              if (((bVar69 == 0) && (fVar79 == 0.0)) && (!NAN(fVar79))) {
                pfVar1 = (float *)(lVar13 + -0x24 + lVar74);
                auVar46._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar46._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar46._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar46._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar75 = movmskps(uVar75,auVar46);
                uVar71 = (ulong)uVar75;
                if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) && ((uVar75 & 4) == 0))
                {
                  bVar69 = ((byte)uVar75 & 8) >> 3;
                  uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                  uVar71 = (ulong)uVar75;
                  if (bVar69 == 0) {
                    pfVar1 = (float *)(lVar13 + -0x14 + lVar74);
                    auVar47._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar47._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar47._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar47._12_4_ = -(uint)(pfVar1[3] != 1.0);
                    uVar75 = movmskps(uVar75,auVar47);
                    uVar71 = (ulong)uVar75;
                    if ((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                       ((uVar75 & 4) == 0)) {
                      bVar69 = ((byte)uVar75 & 8) >> 3;
                      uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
                      uVar71 = (ulong)uVar75;
                      if (bVar69 == 0) {
                        pfVar1 = (float *)(lVar13 + -4 + lVar74);
                        auVar48._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar48._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar48._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar48._12_4_ = -(uint)(pfVar1[3] != 0.0);
                        uVar75 = movmskps(uVar75,auVar48);
                        uVar71 = (ulong)uVar75;
                        if ((((((bVar11 & (byte)uVar75) == 0) && ((uVar75 & 2) == 0)) &&
                             ((uVar75 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar75 & 8) >> 3,
                            uVar71 = (ulong)CONCAT31((int3)(uVar75 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar11 == 0 ||
                            ((fVar123 = *(float *)(lVar13 + 0xc + lVar74), fVar123 == 1.0 &&
                             (!NAN(fVar123))))))) {
                          pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x30);
                          fVar101 = *pfVar1;
                          local_188 = pfVar1[1];
                          fVar104 = pfVar1[2];
                          fVar79 = pfVar1[3];
                          pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x20);
                          fVar113 = *pfVar1;
                          fVar99 = pfVar1[1];
                          fVar121 = pfVar1[2];
                          fVar123 = pfVar1[3];
                          pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x10);
                          fVar105 = *pfVar1;
                          fVar107 = pfVar1[1];
                          fVar109 = pfVar1[2];
                          fVar100 = pfVar1[3];
                          pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
                          fVar128 = *pfVar1;
                          fVar108 = pfVar1[1];
                          fVar92 = pfVar1[2];
                          fVar111 = pfVar1[3];
                          local_168.quaternion = bVar10;
                          goto LAB_00163279;
                        }
                      }
                    }
                  }
                }
              }
            }
            if ((bVar10 == false) && (bVar11 == 0)) {
              pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x30);
              fVar138 = *pfVar1;
              fVar93 = pfVar1[1];
              fVar94 = pfVar1[2];
              fVar95 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x20);
              fVar96 = *pfVar1;
              fVar97 = pfVar1[1];
              fVar98 = pfVar1[2];
              fVar102 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x10);
              fVar103 = *pfVar1;
              fVar136 = pfVar1[1];
              fVar106 = pfVar1[2];
              fVar137 = pfVar1[3];
              fVar101 = fVar113 * fVar138 + fVar128 * fVar96 + fVar79 * fVar103;
              local_188 = fVar113 * fVar93 + fVar128 * fVar97 + fVar79 * fVar136;
              fVar104 = fVar113 * fVar94 + fVar128 * fVar98 + fVar79 * fVar106;
              fVar99 = *(float *)(lVar13 + -0x20 + lVar74);
              fVar6 = *(float *)(lVar13 + -0x1c + lVar74);
              fVar129 = *(float *)(lVar13 + -0x18 + lVar74);
              fVar100 = *(float *)(lVar13 + -0x10 + lVar74);
              fVar121 = fVar99 * fVar94 + fVar6 * fVar98 + fVar129 * fVar106;
              fVar123 = fVar99 * fVar95 + fVar6 * fVar102 + fVar129 * fVar137;
              fVar108 = *(float *)(lVar13 + -0xc + lVar74);
              fVar92 = *(float *)(lVar13 + -8 + lVar74);
              fVar105 = fVar100 * fVar138 + fVar108 * fVar96 + fVar92 * fVar103;
              fVar107 = fVar100 * fVar93 + fVar108 * fVar97 + fVar92 * fVar136;
              fVar109 = fVar100 * fVar94 + fVar108 * fVar98 + fVar92 * fVar106;
              fVar111 = *(float *)(lVar13 + lVar74);
              fVar130 = *(float *)(lVar13 + 4 + lVar74);
              fVar135 = *(float *)(lVar13 + 8 + lVar74);
              pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
              fVar100 = fVar100 * fVar95 + fVar108 * fVar102 + fVar92 * fVar137;
              fVar79 = fVar113 * fVar95 + fVar128 * fVar102 + fVar79 * fVar137;
              fVar128 = fVar111 * fVar138 + fVar130 * fVar96 + fVar135 * fVar103 + *pfVar1;
              fVar108 = fVar111 * fVar93 + fVar130 * fVar97 + fVar135 * fVar136 + pfVar1[1];
              fVar92 = fVar111 * fVar94 + fVar130 * fVar98 + fVar135 * fVar106 + pfVar1[2];
              fVar111 = fVar111 * fVar95 + fVar130 * fVar102 + fVar135 * fVar137 + pfVar1[3];
              fVar113 = fVar99 * fVar138 + fVar6 * fVar96 + fVar129 * fVar103;
              fVar99 = fVar99 * fVar93 + fVar6 * fVar97 + fVar129 * fVar136;
            }
            else if ((bVar10 == false) || (bVar11 == 0)) {
              if ((bVar10 == false) || (bVar11 != 0)) {
                if ((local_188 != 0.0) ||
                   ((((NAN(local_188) || (fVar104 != 0.0)) || (NAN(fVar104))) ||
                    (uVar7 = *(undefined8 *)((long)pAVar61 + lVar74 + -0x10),
                    auVar27._4_4_ = -(uint)(*(float *)((long)pAVar61 + lVar74 + -0x20) != 0.0),
                    auVar27._0_4_ = -(uint)(*(float *)((long)pAVar61 + lVar74 + -0x18) != 0.0),
                    auVar27._8_4_ = -(uint)((float)uVar7 != 0.0),
                    auVar27._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                    uVar59 = movmskps((int)CONCAT71((int7)((ulong)plVar60 >> 8),bVar11),auVar27),
                    (char)uVar59 != '\0')))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                             ,0x83);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                  std::ostream::put(-0x20);
                  std::ostream::flush();
                  uVar71 = extraout_RDX_11;
                }
                pfVar2 = (float *)(lVar13 + -0x30 + lVar74);
                fVar79 = pfVar2[3];
                pfVar3 = (float *)(lVar13 + -0x20 + lVar74);
                fVar113 = *pfVar3;
                fVar123 = pfVar3[3];
                pfVar5 = (float *)(lVar13 + -0x10 + lVar74);
                fVar105 = *pfVar5;
                fVar107 = pfVar5[1];
                fVar100 = pfVar5[3];
                pfVar1 = (float *)(lVar13 + lVar74);
                fVar128 = *pfVar1;
                fVar108 = pfVar1[1];
                fVar92 = pfVar1[2];
                fVar111 = pfVar1[3];
                uVar7 = *(undefined8 *)((long)&(pAVar61->l).vx.field_0 + lVar74);
                fVar101 = *(float *)((long)pAVar61 + lVar74 + -0x30) * *pfVar2;
                local_188 = pfVar2[1] + (float)uVar7;
                fVar104 = pfVar2[2] + (float)((ulong)uVar7 >> 0x20);
                fVar121 = pfVar3[2] + *(float *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 8);
                fVar99 = pfVar3[1] * *(float *)((long)pAVar61 + lVar74 + -0x1c);
                fVar109 = pfVar5[2] * *(float *)((long)pAVar61 + lVar74 + -8);
                local_168.quaternion = true;
              }
              else {
                local_a8 = ZEXT416(*(uint *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 0xc));
                local_108 = ZEXT416(*(uint *)((long)pAVar61 + lVar74 + -0x24));
                local_b8 = ZEXT416(*(uint *)((long)pAVar61 + lVar74 + -4));
                pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x20);
                local_c8 = *pfVar1;
                fStack_c4 = pfVar1[1];
                fStack_bc = pfVar1[3];
                pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x10);
                local_d8 = *pfVar1;
                fStack_d4 = pfVar1[1];
                fStack_d0 = pfVar1[2];
                fStack_cc = pfVar1[3];
                local_98 = *(undefined8 *)((long)pAVar61 + lVar74 + -0x18);
                uStack_90 = 0;
                pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x30);
                fVar79 = *pfVar1;
                fStack_10c = pfVar1[1];
                pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
                fVar113 = *pfVar1;
                fVar128 = pfVar1[1];
                fVar123 = pfVar1[2];
                pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
                fVar105 = *pfVar1;
                fVar107 = pfVar1[1];
                fVar100 = pfVar1[2];
                puVar4 = (undefined8 *)(lVar13 + -0x10 + lVar74);
                local_e8 = *puVar4;
                uStack_e0 = puVar4[1];
                pfVar1 = (float *)(lVar13 + lVar74);
                fVar108 = *pfVar1;
                fVar92 = pfVar1[1];
                fVar111 = pfVar1[2];
                fVar101 = fVar113 * fVar79 + fVar128 * local_c8 + fVar123 * local_d8;
                fVar99 = fVar113 * 0.0 + fVar128 * fStack_c4 + fVar123 * fStack_d4;
                fVar113 = fVar113 * 0.0 + fVar128 * 0.0 + fVar123 * fStack_d0;
                fStack_130 = fVar105 * 0.0 + fVar107 * 0.0 + fVar100 * fStack_d0;
                fStack_12c = fVar105 * fStack_10c + fVar107 * fStack_bc + fVar100 * fStack_cc;
                local_138 = (SubdivMeshNode *)
                            CONCAT44(fVar105 * 0.0 + fVar107 * fStack_c4 + fVar100 * fStack_d4,
                                     fVar105 * fVar79 + fVar107 * local_c8 + fVar100 * local_d8);
                fStack_c0 = 0.0;
                local_118 = (HairSetNode *)(ulong)(uint)fVar79;
                fStack_110 = 0.0;
                pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
                fStack_f0 = fVar108 * 0.0 + fVar92 * 0.0 + fVar111 * fStack_d0 + pfVar1[2];
                fStack_ec = fVar108 * fStack_10c + fVar92 * fStack_bc + fVar111 * fStack_cc +
                            pfVar1[3];
                local_f8.upper =
                     fVar108 * 0.0 + fVar92 * fStack_c4 + fVar111 * fStack_d4 + pfVar1[1];
                local_f8.lower = fVar108 * fVar79 + fVar92 * local_c8 + fVar111 * local_d8 + *pfVar1
                ;
                if ((((fVar99 != 0.0) || (NAN(fVar99))) ||
                    ((fVar113 != 0.0 || ((NAN(fVar113) || (fStack_130 != 0.0)))))) ||
                   (NAN(fStack_130))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                             ,0x61);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                  std::ostream::put(-0x20);
                  std::ostream::flush();
                  uVar71 = extraout_RDX_10;
                }
                fVar105 = (float)local_118 * (float)local_e8 +
                          local_c8 * local_e8._4_4_ + local_d8 * (float)uStack_e0;
                fVar107 = local_118._4_4_ * (float)local_e8 +
                          fStack_c4 * local_e8._4_4_ + fStack_d4 * (float)uStack_e0;
                fVar109 = fStack_110 * (float)local_e8 +
                          fStack_c0 * local_e8._4_4_ + fStack_d0 * (float)uStack_e0;
                local_168.quaternion = true;
                fVar121 = (float)local_98;
                fVar123 = (float)((ulong)local_98 >> 0x20);
                fVar100 = (float)local_b8._0_4_;
                fVar79 = (float)local_108._0_4_;
                fVar128 = local_f8.lower;
                fVar108 = local_f8.upper;
                fVar92 = fStack_f0;
                fVar111 = (float)local_a8._0_4_;
                fVar113 = (float)local_138;
                fVar99 = local_138._4_4_;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                         ,0x67);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
              std::ostream::put(-0x20);
              std::ostream::flush();
              fVar79 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 0xc);
              fVar104 = *(float *)((long)pAVar61 + lVar74 + -0x24);
              fVar113 = *(float *)((long)pAVar61 + lVar74 + -0x14);
              fVar128 = *(float *)((long)pAVar61 + lVar74 + -4);
              auVar9 = *(undefined1 (*) [16])((long)pAVar61 + lVar74 + -0x30);
              pfVar2 = (float *)((long)pAVar61 + lVar74 + -0x20);
              fVar123 = *pfVar2;
              fVar105 = pfVar2[1];
              pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x10);
              fVar107 = *pfVar1;
              fVar100 = pfVar1[1];
              fVar108 = pfVar1[2];
              fVar130 = fVar104 * fVar113 + fVar79 * fVar128;
              fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
              fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                        -fVar128 * fVar128;
              fVar109 = fVar79 * fVar79 - fVar104 * fVar104;
              fVar129 = fVar113 * fVar113 + fVar109 + -fVar128 * fVar128;
              fVar138 = fVar104 * fVar128 - fVar79 * fVar113;
              fVar92 = fVar79 * fVar113 + fVar104 * fVar128;
              fVar135 = fVar113 * fVar128 + fVar79 * fVar104;
              fVar79 = fVar113 * fVar128 - fVar79 * fVar104;
              pfVar1 = (float *)((long)&(pAVar61->l).vx.field_0 + lVar74);
              fVar111 = *pfVar1;
              fVar99 = pfVar1[1];
              fVar6 = pfVar1[2];
              fVar130 = fVar130 + fVar130;
              fVar138 = fVar138 + fVar138;
              fVar101 = fVar101 + fVar101;
              fVar135 = fVar135 + fVar135;
              fVar92 = fVar92 + fVar92;
              fVar79 = fVar79 + fVar79;
              fVar104 = fVar128 * fVar128 + fVar109 + -fVar113 * fVar113;
              fVar117 = fVar121 * 1.0 + fVar130 * 0.0 + fVar138 * 0.0;
              fVar119 = fVar121 * 0.0 + fVar130 * 1.0 + fVar138 * 0.0;
              fVar122 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 1.0;
              fVar124 = fVar121 * 0.0 + fVar130 * 0.0 + fVar138 * 0.0;
              fVar112 = fVar101 * 1.0 + fVar129 * 0.0 + fVar135 * 0.0;
              fVar114 = fVar101 * 0.0 + fVar129 * 1.0 + fVar135 * 0.0;
              fVar115 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 1.0;
              fVar116 = fVar101 * 0.0 + fVar129 * 0.0 + fVar135 * 0.0;
              fVar135 = fVar92 * 1.0 + fVar79 * 0.0 + fVar104 * 0.0;
              fVar93 = fVar92 * 0.0 + fVar79 * 1.0 + fVar104 * 0.0;
              fVar95 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 1.0;
              fVar97 = fVar92 * 0.0 + fVar79 * 0.0 + fVar104 * 0.0;
              local_178 = auVar9._4_4_;
              fStack_174 = auVar9._8_4_;
              local_188 = auVar9._0_4_;
              fVar131 = local_188 * fVar117 + fVar112 * 0.0 + fVar135 * 0.0;
              fVar132 = local_188 * fVar119 + fVar114 * 0.0 + fVar93 * 0.0;
              fVar133 = local_188 * fVar122 + fVar115 * 0.0 + fVar95 * 0.0;
              fVar134 = local_188 * fVar124 + fVar116 * 0.0 + fVar97 * 0.0;
              fVar138 = fVar123 * fVar117 + fVar105 * fVar112 + fVar135 * 0.0;
              fVar94 = fVar123 * fVar119 + fVar105 * fVar114 + fVar93 * 0.0;
              fVar96 = fVar123 * fVar122 + fVar105 * fVar115 + fVar95 * 0.0;
              fVar98 = fVar123 * fVar124 + fVar105 * fVar116 + fVar97 * 0.0;
              fVar129 = fVar107 * fVar117 + fVar100 * fVar112 + fVar108 * fVar135;
              fVar130 = fVar107 * fVar119 + fVar100 * fVar114 + fVar108 * fVar93;
              fStack_130 = fVar107 * fVar122 + fVar100 * fVar115 + fVar108 * fVar95;
              fStack_12c = fVar107 * fVar124 + fVar100 * fVar116 + fVar108 * fVar97;
              local_138 = (SubdivMeshNode *)CONCAT44(fVar130,fVar129);
              fVar79 = *(float *)(lVar13 + 0xc + lVar74);
              fVar104 = *(float *)(lVar13 + -0x24 + lVar74);
              fVar113 = *(float *)(lVar13 + -0x14 + lVar74);
              fVar128 = *(float *)(lVar13 + -4 + lVar74);
              fVar109 = fVar104 * fVar113 + fVar79 * fVar128;
              fVar101 = fVar104 * fVar113 - fVar79 * fVar128;
              fVar121 = fVar79 * fVar79 + fVar104 * fVar104 + -fVar113 * fVar113 +
                        -fVar128 * fVar128;
              fVar105 = fVar79 * fVar79 - fVar104 * fVar104;
              fVar137 = fVar113 * fVar113 + fVar105 + -fVar128 * fVar128;
              fVar136 = fVar104 * fVar128 - fVar79 * fVar113;
              fVar106 = fVar79 * fVar113 + fVar104 * fVar128;
              fVar139 = fVar113 * fVar128 + fVar79 * fVar104;
              fVar92 = fVar113 * fVar128 - fVar79 * fVar104;
              pfVar3 = (float *)(lVar13 + -0x30 + lVar74);
              fVar79 = *pfVar3;
              pfVar5 = (float *)(lVar13 + -0x20 + lVar74);
              fVar104 = *pfVar5;
              fVar123 = pfVar5[1];
              fVar125 = fVar128 * fVar128 + fVar105 + -fVar113 * fVar113;
              pfVar1 = (float *)(lVar13 + -0x10 + lVar74);
              fVar113 = *pfVar1;
              fVar128 = pfVar1[1];
              fVar105 = pfVar1[2];
              fVar109 = fVar109 + fVar109;
              fVar136 = fVar136 + fVar136;
              pfVar1 = (float *)(lVar13 + lVar74);
              fVar107 = *pfVar1;
              fVar100 = pfVar1[1];
              fVar108 = pfVar1[2];
              fVar102 = fVar121 * 1.0 + fVar109 * 0.0 + fVar136 * 0.0;
              fVar103 = fVar121 * 0.0 + fVar109 * 1.0 + fVar136 * 0.0;
              fVar136 = fVar121 * 0.0 + fVar109 * 0.0 + fVar136 * 1.0;
              fVar101 = fVar101 + fVar101;
              fVar139 = fVar139 + fVar139;
              fVar106 = fVar106 + fVar106;
              fVar92 = fVar92 + fVar92;
              fVar121 = fVar101 * 1.0 + fVar137 * 0.0 + fVar139 * 0.0;
              fVar109 = fVar101 * 0.0 + fVar137 * 1.0 + fVar139 * 0.0;
              fVar101 = fVar101 * 0.0 + fVar137 * 0.0 + fVar139 * 1.0;
              fVar137 = fVar106 * 1.0 + fVar92 * 0.0 + fVar125 * 0.0;
              fVar139 = fVar106 * 0.0 + fVar92 * 1.0 + fVar125 * 0.0;
              fVar92 = fVar106 * 0.0 + fVar92 * 0.0 + fVar125 * 1.0;
              fVar118 = fVar79 * fVar102 + fVar121 * 0.0 + fVar137 * 0.0;
              fVar120 = fVar79 * fVar103 + fVar109 * 0.0 + fVar139 * 0.0;
              fVar79 = fVar79 * fVar136 + fVar101 * 0.0 + fVar92 * 0.0;
              fVar106 = fVar104 * fVar102 + fVar123 * fVar121 + fVar137 * 0.0;
              fVar125 = fVar104 * fVar103 + fVar123 * fVar109 + fVar139 * 0.0;
              fVar110 = fVar104 * fVar136 + fVar123 * fVar101 + fVar92 * 0.0;
              fVar126 = fVar113 * fVar102 + fVar128 * fVar121 + fVar105 * fVar137;
              fVar127 = fVar113 * fVar103 + fVar128 * fVar109 + fVar105 * fVar139;
              fVar128 = fVar113 * fVar136 + fVar128 * fVar101 + fVar105 * fVar92;
              fVar113 = fVar107 * fVar102 + fVar100 * fVar121 + fVar108 * fVar137 + pfVar3[1] + 0.0;
              fVar102 = fVar107 * fVar103 + fVar100 * fVar109 + fVar108 * fVar139 + pfVar3[2] + 0.0;
              fVar103 = fVar107 * fVar136 + fVar100 * fVar101 + fVar108 * fVar92 + pfVar5[2] + 0.0;
              fVar101 = fVar118 * fVar131 + fVar120 * fVar138 + fVar79 * fVar129;
              local_188 = fVar118 * fVar132 + fVar120 * fVar94 + fVar79 * fVar130;
              fVar104 = fVar118 * fVar133 + fVar120 * fVar96 + fVar79 * fStack_130;
              fVar121 = fVar106 * fVar133 + fVar125 * fVar96 + fVar110 * fStack_130;
              fVar123 = fVar106 * fVar134 + fVar125 * fVar98 + fVar110 * fStack_12c;
              fVar105 = fVar126 * fVar131 + fVar127 * fVar138 + fVar128 * fVar129;
              fVar107 = fVar126 * fVar132 + fVar127 * fVar94 + fVar128 * fVar130;
              fVar109 = fVar126 * fVar133 + fVar127 * fVar96 + fVar128 * fStack_130;
              uVar71 = extraout_RDX_09;
              fVar100 = fVar126 * fVar134 + fVar127 * fVar98 + fVar128 * fStack_12c;
              fVar79 = fVar118 * fVar134 + fVar120 * fVar98 + fVar79 * fStack_12c;
              fVar128 = fVar113 * fVar131 + fVar102 * fVar138 + fVar103 * fVar129 +
                        fVar111 * fVar117 + fVar99 * fVar112 + fVar6 * fVar135 + local_178 + 0.0;
              fVar108 = fVar113 * fVar132 + fVar102 * fVar94 + fVar103 * fVar130 +
                        fVar111 * fVar119 + fVar99 * fVar114 + fVar6 * fVar93 + fStack_174 + 0.0;
              fVar92 = fVar113 * fVar133 + fVar102 * fVar96 + fVar103 * fStack_130 +
                       fVar111 * fVar122 + fVar99 * fVar115 + fVar6 * fVar95 + pfVar2[2] + 0.0;
              fVar111 = fVar113 * fVar134 + fVar102 * fVar98 + fVar103 * fStack_12c +
                        fVar111 * fVar124 + fVar99 * fVar116 + fVar6 * fVar97 + 0.0;
              fVar113 = fVar106 * fVar131 + fVar125 * fVar138 + fVar110 * fVar129;
              fVar99 = fVar106 * fVar132 + fVar125 * fVar94 + fVar110 * fVar130;
            }
          }
          else {
            pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x24);
            auVar9._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar9._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar9._8_4_ = -(uint)(pfVar1[2] != 1.0);
            auVar9._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar9);
            if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) ||
               (((uVar75 & 4) != 0 ||
                (bVar69 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69),
                bVar69 != 0)))) goto LAB_001627b5;
            pfVar1 = (float *)((long)pAVar61 + lVar74 + -0x14);
            auVar25._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar25._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar25._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar25._12_4_ = -(uint)(pfVar1[3] != 1.0);
            uVar75 = movmskps(uVar75,auVar25);
            if (((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0)) ||
               (bVar69 = ((byte)uVar75 & 8) >> 3, uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69),
               bVar69 != 0)) goto LAB_001627b5;
            pfVar1 = (float *)((long)pAVar61 + lVar74 + -4);
            auVar26._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar26._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar26._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar26._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar75 = movmskps(uVar75,auVar26);
            if ((((bVar10 & (byte)uVar75) != 0) || ((uVar75 & 2) != 0)) || ((uVar75 & 4) != 0))
            goto LAB_001627b5;
            bVar69 = ((byte)uVar75 & 8) >> 3;
            uVar75 = CONCAT31((int3)(uVar75 >> 8),bVar69);
            uVar71 = (ulong)uVar75;
            if ((bVar69 != 0) ||
               ((bVar10 != false &&
                ((fVar79 = *(float *)((long)&(pAVar61->l).vx.field_0 + lVar74 + 0xc), fVar79 != 1.0
                 || (NAN(fVar79))))))) goto LAB_001627b5;
            pfVar1 = (float *)(lVar13 + -0x30 + lVar74);
            fVar101 = *pfVar1;
            local_188 = pfVar1[1];
            fVar104 = pfVar1[2];
            fVar79 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x20 + lVar74);
            fVar113 = *pfVar1;
            fVar99 = pfVar1[1];
            fVar121 = pfVar1[2];
            fVar123 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + -0x10 + lVar74);
            fVar105 = *pfVar1;
            fVar107 = pfVar1[1];
            fVar109 = pfVar1[2];
            fVar100 = pfVar1[3];
            pfVar1 = (float *)(lVar13 + lVar74);
            fVar128 = *pfVar1;
            fVar108 = pfVar1[1];
            fVar92 = pfVar1[2];
            fVar111 = pfVar1[3];
            local_168.quaternion = (bool)bVar11;
          }
LAB_00163279:
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x30);
          *pfVar1 = fVar101;
          pfVar1[1] = local_188;
          pfVar1[2] = fVar104;
          pfVar1[3] = fVar79;
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x20);
          *pfVar1 = fVar113;
          pfVar1[1] = fVar99;
          pfVar1[2] = fVar121;
          pfVar1[3] = fVar123;
          pfVar1 = (float *)((long)local_168.spaces.items + lVar74 + -0x10);
          *pfVar1 = fVar105;
          pfVar1[1] = fVar107;
          pfVar1[2] = fVar109;
          pfVar1[3] = fVar100;
          pfVar1 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar74);
          *pfVar1 = fVar128;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar92;
          pfVar1[3] = fVar111;
          uVar72 = uVar72 + 1;
          lVar74 = lVar74 + 0x40;
          plVar60 = local_88;
        } while (uVar72 < (spaces->spaces).size_active);
      }
    }
    convertGeometries(local_78,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                *)local_120,(Ref<embree::SceneGraph::Node> *)(plVar60 + 0x13),
                      &local_168);
    alignedFree(local_168.spaces.items);
  }
  if (plVar60 != (long *)0x0) {
    (**(code **)(*plVar60 + 0x18))(plVar60);
  }
  return;
}

Assistant:

void convertGeometries(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertGeometries(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
          convertGeometries(group,xfmNode->child, spaces*xfmNode->spaces[i]);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertGeometries(group,child,spaces);
      }
      else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(new SceneGraph::TriangleMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(new SceneGraph::QuadMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(new SceneGraph::GridMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(new SceneGraph::SubdivMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(new SceneGraph::HairSetNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(new SceneGraph::PointSetNode(mesh,spaces));
      }
    }